

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Mat *this_00;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  Allocator *pAVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  void *pvVar22;
  pointer pMVar23;
  uint uVar24;
  long lVar25;
  pointer a;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  void *pvVar29;
  float *ptr1_4;
  void *pvVar30;
  void *pvVar31;
  void *pvVar32;
  int iVar33;
  int iVar34;
  float *ptr_4;
  ulong uVar35;
  float b0;
  float fVar36;
  float fVar37;
  void *local_a0;
  void *local_98;
  ulong local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_68;
  void *local_60;
  ulong local_58;
  
  if (8 < (uint)this->op_type) {
    return 0;
  }
  a = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pMVar1 = a + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(this->op_type) {
  case 0:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar15 = a->w;
    lVar26 = (long)(int)uVar15;
    uVar28 = (ulong)uVar15;
    iVar13 = a->h;
    lVar17 = (long)iVar13;
    uVar2 = a->d;
    uVar14 = a->c;
    uVar35 = (ulong)uVar14;
    uVar18 = iVar13 * uVar15 * uVar2;
    sVar6 = a->elemsize;
    uVar3 = a[1].w;
    lVar25 = (long)(int)uVar3;
    uVar20 = (ulong)uVar3;
    iVar34 = a[1].h;
    lVar16 = (long)iVar34;
    uVar4 = a[1].d;
    uVar5 = a[1].c;
    uVar19 = (ulong)uVar5;
    uVar24 = iVar34 * uVar3 * uVar4;
    switch(a->dims) {
    case 1:
      if (uVar15 == 1) {
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar3,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              fVar36 = *a->data;
              pvVar29 = pMVar1->data;
              uVar19 = 0;
              do {
                *(float *)((long)pvVar31 + uVar19 * 4) =
                     *(float *)((long)pvVar29 + uVar19 * 4) + fVar36;
                uVar19 = uVar19 + 1;
              } while (uVar20 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        case 2:
          Mat::create(this_00,uVar3,iVar34,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar24) {
              fVar36 = *a->data;
              pvVar29 = pMVar1->data;
              uVar19 = 0;
              do {
                *(float *)((long)pvVar31 + uVar19 * 4) =
                     *(float *)((long)pvVar29 + uVar19 * 4) + fVar36;
                uVar19 = uVar19 + 1;
              } while (uVar24 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar29 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar28 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar28 * 4) =
                         *(float *)((long)pvVar29 + uVar28 * 4) + fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar29 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar28 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar28 * 4) =
                         *(float *)((long)pvVar29 + uVar28 * 4) + fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      switch(a[1].dims) {
      case 1:
        goto switchD_003b4ee7_caseD_1;
      case 2:
        Mat::create(this_00,uVar3,iVar34,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < iVar34) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            lVar17 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar36 = *(float *)((long)pvVar29 + lVar17 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar19 * 4) =
                       *(float *)((long)pvVar21 + uVar19 * 4) + fVar36;
                  uVar19 = uVar19 + 1;
                } while (uVar20 != uVar19);
              }
              lVar17 = lVar17 + 1;
              pvVar31 = (void *)((long)pvVar31 + lVar25 * 4);
              pvVar21 = (void *)((long)pvVar21 + lVar25 * 4);
            } while (lVar17 != lVar16);
            return 0;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar35 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar29 + uVar35 * 4);
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar28 * 4) =
                       *(float *)((long)pvVar21 + uVar28 * 4) + fVar36;
                  uVar28 = uVar28 + 1;
                } while (uVar24 != uVar28);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      case 4:
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar35 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar29 + uVar35 * 4);
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar28 * 4) =
                       *(float *)((long)pvVar21 + uVar28 * 4) + fVar36;
                  uVar28 = uVar28 + 1;
                } while (uVar24 != uVar28);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      default:
        return 0;
      }
    case 2:
      pAVar12 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            uVar35 = 0;
            do {
              if (0 < iVar34) {
                lVar17 = 0;
                pvVar22 = pvVar31;
                pvVar30 = pvVar21;
                do {
                  if (0 < (int)uVar3) {
                    fVar36 = *(float *)((long)pvVar29 + lVar17 * 4 + (long)iVar13 * sVar7 * uVar35);
                    uVar28 = 0;
                    do {
                      *(float *)((long)pvVar22 + uVar28 * 4) =
                           *(float *)((long)pvVar30 + uVar28 * 4) + fVar36;
                      uVar28 = uVar28 + 1;
                    } while (uVar20 != uVar28);
                  }
                  lVar17 = lVar17 + 1;
                  pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                  pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                } while (lVar17 != lVar16);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            sVar10 = this_00->elemsize;
            pvVar21 = a[1].data;
            uVar35 = 0;
            do {
              if (0 < (int)uVar4) {
                pvVar30 = (void *)(sVar6 * sVar10 * uVar35 + (long)pvVar31);
                pvVar22 = (void *)(sVar8 * sVar9 * uVar35 + (long)pvVar21);
                uVar28 = 0;
                do {
                  if (0 < iVar34) {
                    fVar36 = *(float *)((long)pvVar29 + uVar28 * 4 + (long)iVar13 * sVar7 * uVar35);
                    iVar33 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar27 = 0;
                        do {
                          *(float *)((long)pvVar30 + uVar27 * 4) =
                               *(float *)((long)pvVar22 + uVar27 * 4) + fVar36;
                          uVar27 = uVar27 + 1;
                        } while (uVar20 != uVar27);
                      }
                      pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                      pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                      iVar33 = iVar33 + 1;
                    } while (iVar33 != iVar34);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar4);
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar15,iVar13,sVar6,pAVar12);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar18) {
          pvVar29 = a->data;
          pvVar21 = a[1].data;
          uVar19 = 0;
          do {
            *(float *)((long)pvVar31 + uVar19 * 4) =
                 *(float *)((long)pvVar21 + uVar19 * 4) + *(float *)((long)pvVar29 + uVar19 * 4);
            uVar19 = uVar19 + 1;
          } while (uVar18 != uVar19);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar15,iVar13,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].w != 1) {
        if (0 < iVar13) {
          pvVar29 = a->data;
          pvVar21 = a[1].data;
          lVar16 = 0;
          do {
            if (0 < (int)uVar15) {
              fVar36 = *(float *)((long)pvVar21 + lVar16 * 4);
              uVar19 = 0;
              do {
                *(float *)((long)pvVar31 + uVar19 * 4) =
                     *(float *)((long)pvVar29 + uVar19 * 4) + fVar36;
                uVar19 = uVar19 + 1;
              } while (uVar28 != uVar19);
            }
            lVar16 = lVar16 + 1;
            pvVar31 = (void *)((long)pvVar31 + lVar26 * 4);
            pvVar29 = (void *)((long)pvVar29 + lVar26 * 4);
          } while (lVar16 != lVar17);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar18) {
        fVar36 = *pMVar1->data;
        pvVar29 = a->data;
        uVar19 = 0;
        do {
          *(float *)((long)pvVar31 + uVar19 * 4) = *(float *)((long)pvVar29 + uVar19 * 4) + fVar36;
          uVar19 = uVar19 + 1;
        } while (uVar18 != uVar19);
        return 0;
      }
      return 0;
    case 4:
      iVar34 = a[1].dims;
      Mat::create(this_00,uVar15,iVar13,uVar2,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (iVar34 == 4) {
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            pvVar21 = a[1].data;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            sVar11 = a->cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar28 * 4) =
                       *(float *)((long)pvVar21 + uVar28 * 4) +
                       *(float *)((long)pvVar29 + uVar28 * 4);
                  uVar28 = uVar28 + 1;
                } while (uVar18 != uVar28);
              }
              uVar19 = uVar19 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
              pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
            } while (uVar19 != uVar35);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 == 0) {
        return -100;
      }
      iVar34 = a[1].dims;
      if (iVar34 == 1) {
        if (a[1].w != 1) {
          if (0 < (int)uVar14) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            pvVar21 = a[1].data;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar18) {
                fVar36 = *(float *)((long)pvVar21 + uVar19 * 4);
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar28 * 4) =
                       *(float *)((long)pvVar29 + uVar28 * 4) + fVar36;
                  uVar28 = uVar28 + 1;
                } while (uVar18 != uVar28);
              }
              uVar19 = uVar19 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
            } while (uVar19 != uVar35);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar36 = *pMVar1->data;
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar28 = 0;
              do {
                *(float *)((long)pvVar31 + uVar28 * 4) =
                     *(float *)((long)pvVar29 + uVar28 * 4) + fVar36;
                uVar28 = uVar28 + 1;
              } while (uVar18 != uVar28);
            }
            uVar19 = uVar19 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      if (iVar34 == 3) {
        if (0 < (int)uVar14) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          sVar9 = a[1].elemsize;
          sVar10 = a[1].cstep;
          sVar11 = this_00->elemsize;
          pvVar21 = a[1].data;
          uVar19 = 0;
          do {
            if (0 < (int)uVar2) {
              pvVar30 = (void *)(sVar6 * sVar11 * uVar19 + (long)pvVar31);
              pvVar22 = (void *)(sVar9 * sVar10 * uVar19 + (long)pvVar21);
              pvVar32 = (void *)(sVar7 * sVar8 * uVar19 + (long)pvVar29);
              uVar14 = 0;
              do {
                if (0 < iVar13) {
                  lVar16 = 0;
                  do {
                    if (0 < (int)uVar15) {
                      fVar36 = *(float *)((long)pvVar22 + lVar16 * 4);
                      uVar20 = 0;
                      do {
                        *(float *)((long)pvVar30 + uVar20 * 4) =
                             *(float *)((long)pvVar32 + uVar20 * 4) + fVar36;
                        uVar20 = uVar20 + 1;
                      } while (uVar28 != uVar20);
                    }
                    pvVar32 = (void *)((long)pvVar32 + lVar26 * 4);
                    pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != lVar17);
                }
                pvVar22 = (void *)((long)pvVar22 + lVar17 * 4);
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar2);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      if (iVar34 != 2) {
        return 0;
      }
      if (0 < (int)uVar14) {
        pvVar29 = a->data;
        sVar7 = a->elemsize;
        sVar8 = a->cstep;
        iVar34 = a[1].w;
        sVar9 = a[1].elemsize;
        sVar10 = this_00->elemsize;
        pvVar21 = a[1].data;
        uVar19 = 0;
        do {
          if (0 < (int)uVar2) {
            pvVar22 = (void *)(sVar6 * sVar10 * uVar19 + (long)pvVar31);
            pvVar30 = (void *)(sVar7 * sVar8 * uVar19 + (long)pvVar29);
            uVar20 = 0;
            do {
              if (0 < iVar13) {
                fVar36 = *(float *)((long)pvVar21 + uVar20 * 4 + (long)iVar34 * sVar9 * uVar19);
                iVar33 = 0;
                do {
                  if (0 < (int)uVar15) {
                    uVar27 = 0;
                    do {
                      *(float *)((long)pvVar22 + uVar27 * 4) =
                           *(float *)((long)pvVar30 + uVar27 * 4) + fVar36;
                      uVar27 = uVar27 + 1;
                    } while (uVar28 != uVar27);
                  }
                  pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                  pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
                  iVar33 = iVar33 + 1;
                } while (iVar33 != iVar13);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != uVar2);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar35);
        return 0;
      }
      return 0;
    }
    if (a[1].dims != 3) {
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar21 = a[1].data;
            uVar35 = 0;
            do {
              if (0 < (int)uVar4) {
                pvVar30 = (void *)(sVar6 * sVar11 * uVar35 + (long)pvVar31);
                pvVar32 = (void *)(sVar9 * sVar10 * uVar35 + (long)pvVar21);
                pvVar22 = (void *)(sVar7 * sVar8 * uVar35 + (long)pvVar29);
                uVar15 = 0;
                do {
                  if (0 < iVar34) {
                    lVar17 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        fVar36 = *(float *)((long)pvVar22 + lVar17 * 4);
                        uVar28 = 0;
                        do {
                          *(float *)((long)pvVar30 + uVar28 * 4) =
                               *(float *)((long)pvVar32 + uVar28 * 4) + fVar36;
                          uVar28 = uVar28 + 1;
                        } while (uVar20 != uVar28);
                      }
                      pvVar32 = (void *)((long)pvVar32 + lVar25 * 4);
                      pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                      lVar17 = lVar17 + 1;
                    } while (lVar17 != lVar16);
                  }
                  pvVar22 = (void *)((long)pvVar22 + lVar16 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar15 != uVar4);
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 == 0) {
        return -100;
      }
      if (a[1].dims == 1) {
        if (a[1].w != 1) {
          if (0 < (int)uVar14) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            pvVar21 = a[1].data;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar18) {
                fVar36 = *(float *)((long)pvVar21 + uVar19 * 4);
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar28 * 4) =
                       *(float *)((long)pvVar29 + uVar28 * 4) + fVar36;
                  uVar28 = uVar28 + 1;
                } while (uVar18 != uVar28);
              }
              uVar19 = uVar19 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
            } while (uVar19 != uVar35);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar36 = *pMVar1->data;
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar28 = 0;
              do {
                *(float *)((long)pvVar31 + uVar28 * 4) =
                     *(float *)((long)pvVar29 + uVar28 * 4) + fVar36;
                uVar28 = uVar28 + 1;
              } while (uVar18 != uVar28);
            }
            uVar19 = uVar19 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      if (a[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar14) {
        pvVar29 = a->data;
        sVar7 = a->elemsize;
        iVar34 = a[1].w;
        sVar8 = a[1].elemsize;
        pvVar21 = a[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = a->cstep;
        uVar19 = 0;
        do {
          if (0 < iVar13) {
            lVar16 = 0;
            pvVar22 = pvVar29;
            pvVar30 = pvVar31;
            do {
              if (0 < (int)uVar15) {
                fVar36 = *(float *)((long)pvVar21 + lVar16 * 4 + (long)iVar34 * sVar8 * uVar19);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar30 + uVar20 * 4) =
                       *(float *)((long)pvVar22 + uVar20 * 4) + fVar36;
                  uVar20 = uVar20 + 1;
                } while (uVar28 != uVar20);
              }
              lVar16 = lVar16 + 1;
              pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
              pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
            } while (lVar16 != lVar17);
          }
          uVar19 = uVar19 + 1;
          pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
          pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar10);
        } while (uVar19 != uVar35);
        return 0;
      }
      return 0;
    }
    if (((uVar3 == 1) && (iVar34 == 1)) && (uVar5 == uVar14)) {
      Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar14) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          pvVar21 = a[1].data;
          sVar8 = a[1].elemsize;
          sVar9 = a[1].cstep;
          sVar10 = this_00->elemsize;
          sVar11 = a->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar28 = 0;
              do {
                *(float *)((long)pvVar31 + uVar28 * 4) =
                     *(float *)((long)pvVar21 + sVar8 * sVar9 * uVar19) +
                     *(float *)((long)pvVar29 + uVar28 * 4);
                uVar28 = uVar28 + 1;
              } while (uVar18 != uVar28);
            }
            uVar19 = uVar19 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((uVar3 == uVar15) && (uVar5 == 1 && iVar34 == iVar13)) {
      Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar14) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          pvVar21 = a[1].data;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar28 = 0;
              do {
                *(float *)((long)pvVar31 + uVar28 * 4) =
                     *(float *)((long)pvVar21 + uVar28 * 4) + *(float *)((long)pvVar29 + uVar28 * 4)
                ;
                uVar28 = uVar28 + 1;
              } while (uVar18 != uVar28);
            }
            uVar19 = uVar19 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar15 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) {
      Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar5) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          pvVar21 = a[1].data;
          sVar9 = a[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = a[1].cstep;
          uVar35 = 0;
          do {
            if (0 < (int)uVar24) {
              uVar28 = 0;
              do {
                *(float *)((long)pvVar31 + uVar28 * 4) =
                     *(float *)((long)pvVar21 + uVar28 * 4) +
                     *(float *)((long)pvVar29 + sVar7 * sVar8 * uVar35);
                uVar28 = uVar28 + 1;
              } while (uVar24 != uVar28);
            }
            uVar35 = uVar35 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar35 != uVar19);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((uVar3 == uVar15) && (uVar14 == 1 && iVar13 == iVar34)) {
      Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar5) {
          pvVar29 = a->data;
          pvVar21 = a[1].data;
          sVar7 = a[1].elemsize;
          sVar8 = this_00->elemsize;
          sVar9 = a[1].cstep;
          uVar35 = 0;
          do {
            if (0 < (int)uVar24) {
              uVar28 = 0;
              do {
                *(float *)((long)pvVar31 + uVar28 * 4) =
                     *(float *)((long)pvVar21 + uVar28 * 4) + *(float *)((long)pvVar29 + uVar28 * 4)
                ;
                uVar28 = uVar28 + 1;
              } while (uVar24 != uVar28);
            }
            uVar35 = uVar35 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
          } while (uVar35 != uVar19);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar15 != 1) && (uVar3 == 1)) && ((iVar34 == iVar13 && (uVar5 == uVar14)))) {
      Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar5) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a[1].elemsize;
          sVar9 = a[1].cstep;
          pvVar21 = a[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = a->cstep;
          uVar35 = 0;
          do {
            if (0 < iVar13) {
              lVar16 = 0;
              pvVar22 = pvVar29;
              pvVar30 = pvVar31;
              do {
                if (0 < (int)uVar15) {
                  fVar36 = *(float *)((long)pvVar21 + lVar16 * 4 + sVar8 * sVar9 * uVar35);
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar30 + uVar20 * 4) =
                         *(float *)((long)pvVar22 + uVar20 * 4) + fVar36;
                    uVar20 = uVar20 + 1;
                  } while (uVar28 != uVar20);
                }
                lVar16 = lVar16 + 1;
                pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
              } while (lVar16 != lVar17);
            }
            uVar35 = uVar35 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
          } while (uVar35 != uVar19);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar3 == uVar15) && (iVar13 != 1)) && (iVar34 == 1)) && (uVar5 == uVar14)) {
      Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar5) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          pvVar21 = a[1].data;
          sVar8 = this_00->elemsize;
          sVar9 = a[1].elemsize;
          sVar10 = a[1].cstep;
          sVar11 = a->cstep;
          uVar35 = 0;
          do {
            if (0 < iVar13) {
              iVar34 = 0;
              pvVar22 = pvVar29;
              pvVar30 = pvVar31;
              do {
                if (0 < (int)uVar15) {
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar30 + uVar20 * 4) =
                         *(float *)((long)pvVar21 + uVar20 * 4) +
                         *(float *)((long)pvVar22 + uVar20 * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar28 != uVar20);
                }
                iVar34 = iVar34 + 1;
                pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
              } while (iVar34 != iVar13);
            }
            uVar35 = uVar35 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar10);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
          } while (uVar35 != uVar19);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar15 == 1) && (uVar3 != 1)) && ((iVar34 == iVar13 && (uVar5 == uVar14)))) {
      Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar5) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          pvVar21 = a[1].data;
          sVar9 = a[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = a[1].cstep;
          uVar35 = 0;
          do {
            if (0 < iVar34) {
              lVar17 = 0;
              pvVar22 = pvVar31;
              pvVar30 = pvVar21;
              do {
                if (0 < (int)uVar3) {
                  fVar36 = *(float *)((long)pvVar29 + lVar17 * 4 + sVar7 * sVar8 * uVar35);
                  uVar28 = 0;
                  do {
                    *(float *)((long)pvVar22 + uVar28 * 4) =
                         *(float *)((long)pvVar30 + uVar28 * 4) + fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar20 != uVar28);
                }
                lVar17 = lVar17 + 1;
                pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
              } while (lVar17 != lVar16);
            }
            uVar35 = uVar35 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar35 != uVar19);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar3 == uVar15) && (iVar34 != 1)) && ((iVar13 == 1 && (uVar5 == uVar14)))) {
      Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar5) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          pvVar21 = a[1].data;
          sVar8 = this_00->elemsize;
          sVar9 = a[1].elemsize;
          sVar10 = a[1].cstep;
          sVar11 = a->cstep;
          uVar35 = 0;
          do {
            if (0 < iVar34) {
              iVar13 = 0;
              pvVar22 = pvVar31;
              pvVar30 = pvVar21;
              do {
                if (0 < (int)uVar3) {
                  uVar28 = 0;
                  do {
                    *(float *)((long)pvVar22 + uVar28 * 4) =
                         *(float *)((long)pvVar30 + uVar28 * 4) +
                         *(float *)((long)pvVar29 + uVar28 * 4);
                    uVar28 = uVar28 + 1;
                  } while (uVar20 != uVar28);
                }
                iVar13 = iVar13 + 1;
                pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
              } while (iVar13 != iVar34);
            }
            uVar35 = uVar35 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar10);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
          } while (uVar35 != uVar19);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
    pvVar31 = this_00->data;
    if (pvVar31 == (void *)0x0) {
      return -100;
    }
    sVar6 = this_00->cstep;
    if ((long)this_00->c * sVar6 != 0) {
      if (0 < (int)uVar14) {
        pvVar29 = a->data;
        sVar7 = a->elemsize;
        pvVar21 = a[1].data;
        sVar8 = a[1].elemsize;
        sVar9 = this_00->elemsize;
        sVar10 = a[1].cstep;
        sVar11 = a->cstep;
        uVar19 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar28 = 0;
            do {
              *(float *)((long)pvVar31 + uVar28 * 4) =
                   *(float *)((long)pvVar21 + uVar28 * 4) + *(float *)((long)pvVar29 + uVar28 * 4);
              uVar28 = uVar28 + 1;
            } while (uVar18 != uVar28);
          }
          uVar19 = uVar19 + 1;
          pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
          pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
          pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
        } while (uVar19 != uVar35);
        return 0;
      }
      return 0;
    }
    return -100;
  case 1:
    pMVar23 = pMVar1;
    break;
  case 2:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar15 = a->w;
    lVar26 = (long)(int)uVar15;
    uVar28 = (ulong)uVar15;
    iVar13 = a->h;
    lVar17 = (long)iVar13;
    uVar2 = a->d;
    uVar14 = a->c;
    uVar35 = (ulong)uVar14;
    uVar18 = iVar13 * uVar15 * uVar2;
    sVar6 = a->elemsize;
    uVar3 = a[1].w;
    lVar25 = (long)(int)uVar3;
    uVar20 = (ulong)uVar3;
    iVar34 = a[1].h;
    lVar16 = (long)iVar34;
    uVar4 = a[1].d;
    uVar5 = a[1].c;
    uVar19 = (ulong)uVar5;
    uVar24 = iVar34 * uVar3 * uVar4;
    switch(a->dims) {
    case 1:
      if (uVar15 == 1) {
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar3,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              fVar36 = *a->data;
              pvVar29 = pMVar1->data;
              uVar19 = 0;
              do {
                *(float *)((long)pvVar31 + uVar19 * 4) =
                     *(float *)((long)pvVar29 + uVar19 * 4) * fVar36;
                uVar19 = uVar19 + 1;
              } while (uVar20 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        case 2:
          Mat::create(this_00,uVar3,iVar34,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar24) {
              fVar36 = *a->data;
              pvVar29 = pMVar1->data;
              uVar19 = 0;
              do {
                *(float *)((long)pvVar31 + uVar19 * 4) =
                     *(float *)((long)pvVar29 + uVar19 * 4) * fVar36;
                uVar19 = uVar19 + 1;
              } while (uVar24 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar29 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar28 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar28 * 4) =
                         *(float *)((long)pvVar29 + uVar28 * 4) * fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar29 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar28 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar28 * 4) =
                         *(float *)((long)pvVar29 + uVar28 * 4) * fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      switch(a[1].dims) {
      case 1:
        goto switchD_003b4e4c_caseD_1;
      case 2:
        Mat::create(this_00,uVar3,iVar34,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < iVar34) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            lVar17 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar36 = *(float *)((long)pvVar29 + lVar17 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar19 * 4) =
                       *(float *)((long)pvVar21 + uVar19 * 4) * fVar36;
                  uVar19 = uVar19 + 1;
                } while (uVar20 != uVar19);
              }
              lVar17 = lVar17 + 1;
              pvVar31 = (void *)((long)pvVar31 + lVar25 * 4);
              pvVar21 = (void *)((long)pvVar21 + lVar25 * 4);
            } while (lVar17 != lVar16);
            return 0;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar35 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar29 + uVar35 * 4);
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar28 * 4) =
                       *(float *)((long)pvVar21 + uVar28 * 4) * fVar36;
                  uVar28 = uVar28 + 1;
                } while (uVar24 != uVar28);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      case 4:
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar35 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar29 + uVar35 * 4);
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar28 * 4) =
                       *(float *)((long)pvVar21 + uVar28 * 4) * fVar36;
                  uVar28 = uVar28 + 1;
                } while (uVar24 != uVar28);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      default:
        return 0;
      }
    case 2:
      pAVar12 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            uVar35 = 0;
            do {
              if (0 < iVar34) {
                lVar17 = 0;
                pvVar22 = pvVar31;
                pvVar30 = pvVar21;
                do {
                  if (0 < (int)uVar3) {
                    fVar36 = *(float *)((long)pvVar29 + lVar17 * 4 + (long)iVar13 * sVar7 * uVar35);
                    uVar28 = 0;
                    do {
                      *(float *)((long)pvVar22 + uVar28 * 4) =
                           *(float *)((long)pvVar30 + uVar28 * 4) * fVar36;
                      uVar28 = uVar28 + 1;
                    } while (uVar20 != uVar28);
                  }
                  lVar17 = lVar17 + 1;
                  pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                  pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                } while (lVar17 != lVar16);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            sVar10 = this_00->elemsize;
            pvVar21 = a[1].data;
            uVar35 = 0;
            do {
              if (0 < (int)uVar4) {
                pvVar30 = (void *)(sVar6 * sVar10 * uVar35 + (long)pvVar31);
                pvVar22 = (void *)(sVar8 * sVar9 * uVar35 + (long)pvVar21);
                uVar28 = 0;
                do {
                  if (0 < iVar34) {
                    fVar36 = *(float *)((long)pvVar29 + uVar28 * 4 + (long)iVar13 * sVar7 * uVar35);
                    iVar33 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar27 = 0;
                        do {
                          *(float *)((long)pvVar30 + uVar27 * 4) =
                               *(float *)((long)pvVar22 + uVar27 * 4) * fVar36;
                          uVar27 = uVar27 + 1;
                        } while (uVar20 != uVar27);
                      }
                      pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                      pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                      iVar33 = iVar33 + 1;
                    } while (iVar33 != iVar34);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar4);
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar15,iVar13,sVar6,pAVar12);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar18) {
          pvVar29 = a->data;
          pvVar21 = a[1].data;
          uVar19 = 0;
          do {
            *(float *)((long)pvVar31 + uVar19 * 4) =
                 *(float *)((long)pvVar21 + uVar19 * 4) * *(float *)((long)pvVar29 + uVar19 * 4);
            uVar19 = uVar19 + 1;
          } while (uVar18 != uVar19);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar15,iVar13,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].w != 1) {
        if (0 < iVar13) {
          pvVar29 = a->data;
          pvVar21 = a[1].data;
          lVar16 = 0;
          do {
            if (0 < (int)uVar15) {
              fVar36 = *(float *)((long)pvVar21 + lVar16 * 4);
              uVar19 = 0;
              do {
                *(float *)((long)pvVar31 + uVar19 * 4) =
                     *(float *)((long)pvVar29 + uVar19 * 4) * fVar36;
                uVar19 = uVar19 + 1;
              } while (uVar28 != uVar19);
            }
            lVar16 = lVar16 + 1;
            pvVar31 = (void *)((long)pvVar31 + lVar26 * 4);
            pvVar29 = (void *)((long)pvVar29 + lVar26 * 4);
          } while (lVar16 != lVar17);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar18) {
        fVar36 = *pMVar1->data;
        pvVar29 = a->data;
        uVar19 = 0;
        do {
          *(float *)((long)pvVar31 + uVar19 * 4) = *(float *)((long)pvVar29 + uVar19 * 4) * fVar36;
          uVar19 = uVar19 + 1;
        } while (uVar18 != uVar19);
        return 0;
      }
      return 0;
    case 4:
      iVar34 = a[1].dims;
      Mat::create(this_00,uVar15,iVar13,uVar2,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (iVar34 == 4) {
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            pvVar21 = a[1].data;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            sVar11 = a->cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar28 * 4) =
                       *(float *)((long)pvVar21 + uVar28 * 4) *
                       *(float *)((long)pvVar29 + uVar28 * 4);
                  uVar28 = uVar28 + 1;
                } while (uVar18 != uVar28);
              }
              uVar19 = uVar19 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
              pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
            } while (uVar19 != uVar35);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 == 0) {
        return -100;
      }
      iVar34 = a[1].dims;
      if (iVar34 == 1) {
        if (a[1].w != 1) {
          if (0 < (int)uVar14) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            pvVar21 = a[1].data;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar18) {
                fVar36 = *(float *)((long)pvVar21 + uVar19 * 4);
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar28 * 4) =
                       *(float *)((long)pvVar29 + uVar28 * 4) * fVar36;
                  uVar28 = uVar28 + 1;
                } while (uVar18 != uVar28);
              }
              uVar19 = uVar19 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
            } while (uVar19 != uVar35);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar36 = *pMVar1->data;
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar28 = 0;
              do {
                *(float *)((long)pvVar31 + uVar28 * 4) =
                     *(float *)((long)pvVar29 + uVar28 * 4) * fVar36;
                uVar28 = uVar28 + 1;
              } while (uVar18 != uVar28);
            }
            uVar19 = uVar19 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      if (iVar34 == 3) {
        if (0 < (int)uVar14) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          sVar9 = a[1].elemsize;
          sVar10 = a[1].cstep;
          sVar11 = this_00->elemsize;
          pvVar21 = a[1].data;
          uVar19 = 0;
          do {
            if (0 < (int)uVar2) {
              pvVar30 = (void *)(sVar6 * sVar11 * uVar19 + (long)pvVar31);
              pvVar22 = (void *)(sVar9 * sVar10 * uVar19 + (long)pvVar21);
              pvVar32 = (void *)(sVar7 * sVar8 * uVar19 + (long)pvVar29);
              uVar14 = 0;
              do {
                if (0 < iVar13) {
                  lVar16 = 0;
                  do {
                    if (0 < (int)uVar15) {
                      fVar36 = *(float *)((long)pvVar22 + lVar16 * 4);
                      uVar20 = 0;
                      do {
                        *(float *)((long)pvVar30 + uVar20 * 4) =
                             *(float *)((long)pvVar32 + uVar20 * 4) * fVar36;
                        uVar20 = uVar20 + 1;
                      } while (uVar28 != uVar20);
                    }
                    pvVar32 = (void *)((long)pvVar32 + lVar26 * 4);
                    pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != lVar17);
                }
                pvVar22 = (void *)((long)pvVar22 + lVar17 * 4);
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar2);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      if (iVar34 != 2) {
        return 0;
      }
      if (0 < (int)uVar14) {
        pvVar29 = a->data;
        sVar7 = a->elemsize;
        sVar8 = a->cstep;
        iVar34 = a[1].w;
        sVar9 = a[1].elemsize;
        sVar10 = this_00->elemsize;
        pvVar21 = a[1].data;
        uVar19 = 0;
        do {
          if (0 < (int)uVar2) {
            pvVar22 = (void *)(sVar6 * sVar10 * uVar19 + (long)pvVar31);
            pvVar30 = (void *)(sVar7 * sVar8 * uVar19 + (long)pvVar29);
            uVar20 = 0;
            do {
              if (0 < iVar13) {
                fVar36 = *(float *)((long)pvVar21 + uVar20 * 4 + (long)iVar34 * sVar9 * uVar19);
                iVar33 = 0;
                do {
                  if (0 < (int)uVar15) {
                    uVar27 = 0;
                    do {
                      *(float *)((long)pvVar22 + uVar27 * 4) =
                           *(float *)((long)pvVar30 + uVar27 * 4) * fVar36;
                      uVar27 = uVar27 + 1;
                    } while (uVar28 != uVar27);
                  }
                  pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                  pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
                  iVar33 = iVar33 + 1;
                } while (iVar33 != iVar13);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != uVar2);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar35);
        return 0;
      }
      return 0;
    }
    if (a[1].dims != 3) {
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar21 = a[1].data;
            uVar35 = 0;
            do {
              if (0 < (int)uVar4) {
                pvVar30 = (void *)(sVar6 * sVar11 * uVar35 + (long)pvVar31);
                pvVar32 = (void *)(sVar9 * sVar10 * uVar35 + (long)pvVar21);
                pvVar22 = (void *)(sVar7 * sVar8 * uVar35 + (long)pvVar29);
                uVar15 = 0;
                do {
                  if (0 < iVar34) {
                    lVar17 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        fVar36 = *(float *)((long)pvVar22 + lVar17 * 4);
                        uVar28 = 0;
                        do {
                          *(float *)((long)pvVar30 + uVar28 * 4) =
                               *(float *)((long)pvVar32 + uVar28 * 4) * fVar36;
                          uVar28 = uVar28 + 1;
                        } while (uVar20 != uVar28);
                      }
                      pvVar32 = (void *)((long)pvVar32 + lVar25 * 4);
                      pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                      lVar17 = lVar17 + 1;
                    } while (lVar17 != lVar16);
                  }
                  pvVar22 = (void *)((long)pvVar22 + lVar16 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar15 != uVar4);
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 == 0) {
        return -100;
      }
      if (a[1].dims == 1) {
        if (a[1].w != 1) {
          if (0 < (int)uVar14) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            pvVar21 = a[1].data;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar18) {
                fVar36 = *(float *)((long)pvVar21 + uVar19 * 4);
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar28 * 4) =
                       *(float *)((long)pvVar29 + uVar28 * 4) * fVar36;
                  uVar28 = uVar28 + 1;
                } while (uVar18 != uVar28);
              }
              uVar19 = uVar19 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
            } while (uVar19 != uVar35);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar36 = *pMVar1->data;
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar28 = 0;
              do {
                *(float *)((long)pvVar31 + uVar28 * 4) =
                     *(float *)((long)pvVar29 + uVar28 * 4) * fVar36;
                uVar28 = uVar28 + 1;
              } while (uVar18 != uVar28);
            }
            uVar19 = uVar19 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      if (a[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar14) {
        pvVar29 = a->data;
        sVar7 = a->elemsize;
        iVar34 = a[1].w;
        sVar8 = a[1].elemsize;
        pvVar21 = a[1].data;
        sVar9 = this_00->elemsize;
        sVar10 = a->cstep;
        uVar19 = 0;
        do {
          if (0 < iVar13) {
            lVar16 = 0;
            pvVar22 = pvVar29;
            pvVar30 = pvVar31;
            do {
              if (0 < (int)uVar15) {
                fVar36 = *(float *)((long)pvVar21 + lVar16 * 4 + (long)iVar34 * sVar8 * uVar19);
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar30 + uVar20 * 4) =
                       *(float *)((long)pvVar22 + uVar20 * 4) * fVar36;
                  uVar20 = uVar20 + 1;
                } while (uVar28 != uVar20);
              }
              lVar16 = lVar16 + 1;
              pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
              pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
            } while (lVar16 != lVar17);
          }
          uVar19 = uVar19 + 1;
          pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
          pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar10);
        } while (uVar19 != uVar35);
        return 0;
      }
      return 0;
    }
    if (((uVar3 == 1) && (iVar34 == 1)) && (uVar5 == uVar14)) {
      Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar14) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          pvVar21 = a[1].data;
          sVar8 = a[1].elemsize;
          sVar9 = a[1].cstep;
          sVar10 = this_00->elemsize;
          sVar11 = a->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar28 = 0;
              do {
                *(float *)((long)pvVar31 + uVar28 * 4) =
                     *(float *)((long)pvVar21 + sVar8 * sVar9 * uVar19) *
                     *(float *)((long)pvVar29 + uVar28 * 4);
                uVar28 = uVar28 + 1;
              } while (uVar18 != uVar28);
            }
            uVar19 = uVar19 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((uVar3 == uVar15) && (uVar5 == 1 && iVar34 == iVar13)) {
      Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar14) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          pvVar21 = a[1].data;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar28 = 0;
              do {
                *(float *)((long)pvVar31 + uVar28 * 4) =
                     *(float *)((long)pvVar21 + uVar28 * 4) * *(float *)((long)pvVar29 + uVar28 * 4)
                ;
                uVar28 = uVar28 + 1;
              } while (uVar18 != uVar28);
            }
            uVar19 = uVar19 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar15 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) {
      Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar5) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          pvVar21 = a[1].data;
          sVar9 = a[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = a[1].cstep;
          uVar35 = 0;
          do {
            if (0 < (int)uVar24) {
              uVar28 = 0;
              do {
                *(float *)((long)pvVar31 + uVar28 * 4) =
                     *(float *)((long)pvVar21 + uVar28 * 4) *
                     *(float *)((long)pvVar29 + sVar7 * sVar8 * uVar35);
                uVar28 = uVar28 + 1;
              } while (uVar24 != uVar28);
            }
            uVar35 = uVar35 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar35 != uVar19);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((uVar3 == uVar15) && (uVar14 == 1 && iVar13 == iVar34)) {
      Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar5) {
          pvVar29 = a->data;
          pvVar21 = a[1].data;
          sVar7 = a[1].elemsize;
          sVar8 = this_00->elemsize;
          sVar9 = a[1].cstep;
          uVar35 = 0;
          do {
            if (0 < (int)uVar24) {
              uVar28 = 0;
              do {
                *(float *)((long)pvVar31 + uVar28 * 4) =
                     *(float *)((long)pvVar21 + uVar28 * 4) * *(float *)((long)pvVar29 + uVar28 * 4)
                ;
                uVar28 = uVar28 + 1;
              } while (uVar24 != uVar28);
            }
            uVar35 = uVar35 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
          } while (uVar35 != uVar19);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar15 != 1) && (uVar3 == 1)) && (iVar34 == iVar13)) && (uVar5 == uVar14)) {
      Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar5) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a[1].elemsize;
          sVar9 = a[1].cstep;
          pvVar21 = a[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = a->cstep;
          uVar35 = 0;
          do {
            if (0 < iVar13) {
              lVar16 = 0;
              pvVar22 = pvVar29;
              pvVar30 = pvVar31;
              do {
                if (0 < (int)uVar15) {
                  fVar36 = *(float *)((long)pvVar21 + lVar16 * 4 + sVar8 * sVar9 * uVar35);
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar30 + uVar20 * 4) =
                         *(float *)((long)pvVar22 + uVar20 * 4) * fVar36;
                    uVar20 = uVar20 + 1;
                  } while (uVar28 != uVar20);
                }
                lVar16 = lVar16 + 1;
                pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
              } while (lVar16 != lVar17);
            }
            uVar35 = uVar35 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
          } while (uVar35 != uVar19);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar3 == uVar15) && (iVar13 != 1)) && ((iVar34 == 1 && (uVar5 == uVar14)))) {
      Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar5) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          pvVar21 = a[1].data;
          sVar8 = this_00->elemsize;
          sVar9 = a[1].elemsize;
          sVar10 = a[1].cstep;
          sVar11 = a->cstep;
          uVar35 = 0;
          do {
            if (0 < iVar13) {
              iVar34 = 0;
              pvVar22 = pvVar29;
              pvVar30 = pvVar31;
              do {
                if (0 < (int)uVar15) {
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar30 + uVar20 * 4) =
                         *(float *)((long)pvVar21 + uVar20 * 4) *
                         *(float *)((long)pvVar22 + uVar20 * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar28 != uVar20);
                }
                iVar34 = iVar34 + 1;
                pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
              } while (iVar34 != iVar13);
            }
            uVar35 = uVar35 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar10);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
          } while (uVar35 != uVar19);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (((uVar15 == 1) && (uVar3 != 1)) && ((iVar34 == iVar13 && (uVar5 == uVar14)))) {
      Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar5) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          pvVar21 = a[1].data;
          sVar9 = a[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = a[1].cstep;
          uVar35 = 0;
          do {
            if (0 < iVar34) {
              lVar17 = 0;
              pvVar22 = pvVar31;
              pvVar30 = pvVar21;
              do {
                if (0 < (int)uVar3) {
                  fVar36 = *(float *)((long)pvVar29 + lVar17 * 4 + sVar7 * sVar8 * uVar35);
                  uVar28 = 0;
                  do {
                    *(float *)((long)pvVar22 + uVar28 * 4) =
                         *(float *)((long)pvVar30 + uVar28 * 4) * fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar20 != uVar28);
                }
                lVar17 = lVar17 + 1;
                pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
              } while (lVar17 != lVar16);
            }
            uVar35 = uVar35 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
          } while (uVar35 != uVar19);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if ((((uVar3 == uVar15) && (iVar34 != 1)) && (iVar13 == 1)) && (uVar5 == uVar14)) {
      Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar5) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          pvVar21 = a[1].data;
          sVar8 = this_00->elemsize;
          sVar9 = a[1].elemsize;
          sVar10 = a[1].cstep;
          sVar11 = a->cstep;
          uVar35 = 0;
          do {
            if (0 < iVar34) {
              iVar13 = 0;
              pvVar22 = pvVar31;
              pvVar30 = pvVar21;
              do {
                if (0 < (int)uVar3) {
                  uVar28 = 0;
                  do {
                    *(float *)((long)pvVar22 + uVar28 * 4) =
                         *(float *)((long)pvVar30 + uVar28 * 4) *
                         *(float *)((long)pvVar29 + uVar28 * 4);
                    uVar28 = uVar28 + 1;
                  } while (uVar20 != uVar28);
                }
                iVar13 = iVar13 + 1;
                pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
              } while (iVar13 != iVar34);
            }
            uVar35 = uVar35 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar10);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
          } while (uVar35 != uVar19);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
    pvVar31 = this_00->data;
    if (pvVar31 == (void *)0x0) {
      return -100;
    }
    sVar6 = this_00->cstep;
    if ((long)this_00->c * sVar6 != 0) {
      if (0 < (int)uVar14) {
        pvVar29 = a->data;
        sVar7 = a->elemsize;
        pvVar21 = a[1].data;
        sVar8 = a[1].elemsize;
        sVar9 = this_00->elemsize;
        sVar10 = a[1].cstep;
        sVar11 = a->cstep;
        uVar19 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar28 = 0;
            do {
              *(float *)((long)pvVar31 + uVar28 * 4) =
                   *(float *)((long)pvVar21 + uVar28 * 4) * *(float *)((long)pvVar29 + uVar28 * 4);
              uVar28 = uVar28 + 1;
            } while (uVar18 != uVar28);
          }
          uVar19 = uVar19 + 1;
          pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
          pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
          pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
        } while (uVar19 != uVar35);
        return 0;
      }
      return 0;
    }
    return -100;
  case 3:
    pMVar23 = pMVar1;
    goto LAB_003b3b9b;
  case 4:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar15 = a->w;
    lVar26 = (long)(int)uVar15;
    uVar28 = (ulong)uVar15;
    iVar13 = a->h;
    lVar17 = (long)iVar13;
    uVar2 = a->d;
    uVar14 = a->c;
    uVar35 = (ulong)uVar14;
    uVar18 = iVar13 * uVar15 * uVar2;
    sVar6 = a->elemsize;
    uVar3 = a[1].w;
    lVar25 = (long)(int)uVar3;
    uVar20 = (ulong)uVar3;
    iVar34 = a[1].h;
    lVar16 = (long)iVar34;
    uVar4 = a[1].d;
    uVar5 = a[1].c;
    uVar19 = (ulong)uVar5;
    uVar24 = iVar34 * uVar3 * uVar4;
    switch(a->dims) {
    case 1:
      if (uVar15 == 1) {
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar3,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              fVar36 = *a->data;
              pvVar29 = pMVar1->data;
              uVar19 = 0;
              do {
                fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
                if (fVar37 <= fVar36) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                uVar19 = uVar19 + 1;
              } while (uVar20 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        case 2:
          Mat::create(this_00,uVar3,iVar34,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar24) {
              fVar36 = *a->data;
              pvVar29 = pMVar1->data;
              uVar19 = 0;
              do {
                fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
                if (fVar37 <= fVar36) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                uVar19 = uVar19 + 1;
              } while (uVar24 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar29 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar28 = 0;
                  do {
                    fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                    if (fVar37 <= fVar36) {
                      fVar37 = fVar36;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar29 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar28 = 0;
                  do {
                    fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                    if (fVar37 <= fVar36) {
                      fVar37 = fVar36;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      switch(a[1].dims) {
      case 1:
        Mat::create(this_00,uVar15,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].w != 1) {
          if (0 < (int)uVar15) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            uVar19 = 0;
            do {
              fVar36 = *(float *)((long)pvVar21 + uVar19 * 4);
              fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
              if (fVar36 <= fVar37) {
                fVar36 = fVar37;
              }
              *(float *)((long)pvVar31 + uVar19 * 4) = fVar36;
              uVar19 = uVar19 + 1;
            } while (uVar28 != uVar19);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar15) {
          fVar36 = *pMVar1->data;
          pvVar29 = a->data;
          uVar19 = 0;
          do {
            fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
            if (fVar37 <= fVar36) {
              fVar37 = fVar36;
            }
            *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
            uVar19 = uVar19 + 1;
          } while (uVar28 != uVar19);
          return 0;
        }
        return 0;
      case 2:
        Mat::create(this_00,uVar3,iVar34,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < iVar34) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            lVar17 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar36 = *(float *)((long)pvVar29 + lVar17 * 4);
                uVar19 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar21 + uVar19 * 4);
                  if (fVar37 <= fVar36) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                  uVar19 = uVar19 + 1;
                } while (uVar20 != uVar19);
              }
              lVar17 = lVar17 + 1;
              pvVar31 = (void *)((long)pvVar31 + lVar25 * 4);
              pvVar21 = (void *)((long)pvVar21 + lVar25 * 4);
            } while (lVar17 != lVar16);
            return 0;
          }
          return 0;
        }
        break;
      case 3:
        Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar35 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar29 + uVar35 * 4);
                uVar28 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar21 + uVar28 * 4);
                  if (fVar37 <= fVar36) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                  uVar28 = uVar28 + 1;
                } while (uVar24 != uVar28);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        break;
      case 4:
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar35 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar29 + uVar35 * 4);
                uVar28 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar21 + uVar28 * 4);
                  if (fVar37 <= fVar36) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                  uVar28 = uVar28 + 1;
                } while (uVar24 != uVar28);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        break;
      default:
        goto LAB_003bb987;
      }
      break;
    case 2:
      pAVar12 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            uVar35 = 0;
            do {
              if (0 < iVar34) {
                lVar17 = 0;
                pvVar22 = pvVar31;
                pvVar30 = pvVar21;
                do {
                  if (0 < (int)uVar3) {
                    fVar36 = *(float *)((long)pvVar29 + lVar17 * 4 + (long)iVar13 * sVar7 * uVar35);
                    uVar28 = 0;
                    do {
                      fVar37 = *(float *)((long)pvVar30 + uVar28 * 4);
                      if (fVar37 <= fVar36) {
                        fVar37 = fVar36;
                      }
                      *(float *)((long)pvVar22 + uVar28 * 4) = fVar37;
                      uVar28 = uVar28 + 1;
                    } while (uVar20 != uVar28);
                  }
                  lVar17 = lVar17 + 1;
                  pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                  pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                } while (lVar17 != lVar16);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
      }
      else if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            sVar10 = this_00->elemsize;
            pvVar21 = a[1].data;
            uVar35 = 0;
            do {
              if (0 < (int)uVar4) {
                pvVar30 = (void *)(sVar6 * sVar10 * uVar35 + (long)pvVar31);
                pvVar22 = (void *)(sVar8 * sVar9 * uVar35 + (long)pvVar21);
                uVar28 = 0;
                do {
                  if (0 < iVar34) {
                    fVar36 = *(float *)((long)pvVar29 + uVar28 * 4 + (long)iVar13 * sVar7 * uVar35);
                    iVar33 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar27 = 0;
                        do {
                          fVar37 = *(float *)((long)pvVar22 + uVar27 * 4);
                          if (fVar37 <= fVar36) {
                            fVar37 = fVar36;
                          }
                          *(float *)((long)pvVar30 + uVar27 * 4) = fVar37;
                          uVar27 = uVar27 + 1;
                        } while (uVar20 != uVar27);
                      }
                      pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                      pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                      iVar33 = iVar33 + 1;
                    } while (iVar33 != iVar34);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar4);
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
      }
      else {
        Mat::create(this_00,uVar15,iVar13,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if ((pvVar31 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          if (a[1].dims != 1) {
            if (a[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar18) {
              pvVar29 = a->data;
              pvVar21 = a[1].data;
              uVar19 = 0;
              do {
                fVar36 = *(float *)((long)pvVar21 + uVar19 * 4);
                fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
                if (fVar36 <= fVar37) {
                  fVar36 = fVar37;
                }
                *(float *)((long)pvVar31 + uVar19 * 4) = fVar36;
                uVar19 = uVar19 + 1;
              } while (uVar18 != uVar19);
              return 0;
            }
            return 0;
          }
          Mat::create(this_00,uVar15,iVar13,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (a[1].w != 1) {
            if (0 < iVar13) {
              pvVar29 = a->data;
              pvVar21 = a[1].data;
              lVar16 = 0;
              do {
                if (0 < (int)uVar15) {
                  fVar36 = *(float *)((long)pvVar21 + lVar16 * 4);
                  uVar19 = 0;
                  do {
                    fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
                    if (fVar37 <= fVar36) {
                      fVar37 = fVar36;
                    }
                    *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                    uVar19 = uVar19 + 1;
                  } while (uVar28 != uVar19);
                }
                lVar16 = lVar16 + 1;
                pvVar31 = (void *)((long)pvVar31 + lVar26 * 4);
                pvVar29 = (void *)((long)pvVar29 + lVar26 * 4);
              } while (lVar16 != lVar17);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar18) {
            fVar36 = *pMVar1->data;
            pvVar29 = a->data;
            uVar19 = 0;
            do {
              fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
              if (fVar37 <= fVar36) {
                fVar37 = fVar36;
              }
              *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
              uVar19 = uVar19 + 1;
            } while (uVar18 != uVar19);
            return 0;
          }
          return 0;
        }
      }
      break;
    case 3:
      if (a[1].dims == 3) {
        if (((uVar3 == 1) && (iVar34 == 1)) && (uVar5 == uVar14)) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              pvVar21 = a[1].data;
              sVar8 = a[1].elemsize;
              sVar9 = a[1].cstep;
              sVar10 = this_00->elemsize;
              sVar11 = a->cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar28 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar21 + sVar8 * sVar9 * uVar19);
                    fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                    if (fVar36 <= fVar37) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar18 != uVar28);
                }
                uVar19 = uVar19 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
              } while (uVar19 != uVar35);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar3 == uVar15) && (uVar5 == 1 && iVar34 == iVar13)) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              pvVar21 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar28 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar21 + uVar28 * 4);
                    fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                    if (fVar36 <= fVar37) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar18 != uVar28);
                }
                uVar19 = uVar19 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar19 != uVar35);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar15 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) {
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              pvVar21 = a[1].data;
              sVar9 = a[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar28 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar21 + uVar28 * 4);
                    fVar37 = *(float *)((long)pvVar29 + sVar7 * sVar8 * uVar35);
                    if (fVar36 <= fVar37) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar3 == uVar15) && (uVar14 == 1 && iVar13 == iVar34)) {
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              pvVar21 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar28 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar21 + uVar28 * 4);
                    fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                    if (fVar36 <= fVar37) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
        }
        else if (((uVar15 == 1) || ((uVar3 != 1 || (iVar34 != iVar13)))) || (uVar5 != uVar14)) {
          if ((((uVar3 == uVar15) && (iVar13 != 1)) && (iVar34 == 1)) && (uVar5 == uVar14)) {
            Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 != (void *)0x0) {
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 == 0) {
                return -100;
              }
              if (0 < (int)uVar5) {
                pvVar29 = a->data;
                sVar7 = a->elemsize;
                pvVar21 = a[1].data;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].elemsize;
                sVar10 = a[1].cstep;
                sVar11 = a->cstep;
                uVar35 = 0;
                do {
                  if (0 < iVar13) {
                    iVar34 = 0;
                    pvVar22 = pvVar29;
                    pvVar30 = pvVar31;
                    do {
                      if (0 < (int)uVar15) {
                        uVar20 = 0;
                        do {
                          fVar36 = *(float *)((long)pvVar21 + uVar20 * 4);
                          fVar37 = *(float *)((long)pvVar22 + uVar20 * 4);
                          if (fVar36 <= fVar37) {
                            fVar36 = fVar37;
                          }
                          *(float *)((long)pvVar30 + uVar20 * 4) = fVar36;
                          uVar20 = uVar20 + 1;
                        } while (uVar28 != uVar20);
                      }
                      iVar34 = iVar34 + 1;
                      pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                      pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
                    } while (iVar34 != iVar13);
                  }
                  uVar35 = uVar35 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar10);
                  pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
                } while (uVar35 != uVar19);
                return 0;
              }
              return 0;
            }
          }
          else if (((uVar15 == 1) && (uVar3 != 1)) && ((iVar34 == iVar13 && (uVar5 == uVar14)))) {
            Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 != (void *)0x0) {
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 == 0) {
                return -100;
              }
              if (0 < (int)uVar5) {
                pvVar29 = a->data;
                sVar7 = a->elemsize;
                sVar8 = a->cstep;
                pvVar21 = a[1].data;
                sVar9 = a[1].elemsize;
                sVar10 = this_00->elemsize;
                sVar11 = a[1].cstep;
                uVar35 = 0;
                do {
                  if (0 < iVar34) {
                    lVar17 = 0;
                    pvVar22 = pvVar31;
                    pvVar30 = pvVar21;
                    do {
                      if (0 < (int)uVar3) {
                        fVar36 = *(float *)((long)pvVar29 + lVar17 * 4 + sVar7 * sVar8 * uVar35);
                        uVar28 = 0;
                        do {
                          fVar37 = *(float *)((long)pvVar30 + uVar28 * 4);
                          if (fVar37 <= fVar36) {
                            fVar37 = fVar36;
                          }
                          *(float *)((long)pvVar22 + uVar28 * 4) = fVar37;
                          uVar28 = uVar28 + 1;
                        } while (uVar20 != uVar28);
                      }
                      lVar17 = lVar17 + 1;
                      pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                      pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                    } while (lVar17 != lVar16);
                  }
                  uVar35 = uVar35 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                  pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
                } while (uVar35 != uVar19);
                return 0;
              }
              return 0;
            }
          }
          else if (((uVar3 == uVar15) && (iVar34 != 1)) && ((iVar13 == 1 && (uVar5 == uVar14)))) {
            Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 != (void *)0x0) {
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 == 0) {
                return -100;
              }
              if (0 < (int)uVar5) {
                pvVar29 = a->data;
                sVar7 = a->elemsize;
                pvVar21 = a[1].data;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].elemsize;
                sVar10 = a[1].cstep;
                sVar11 = a->cstep;
                uVar35 = 0;
                do {
                  if (0 < iVar34) {
                    iVar13 = 0;
                    pvVar22 = pvVar31;
                    pvVar30 = pvVar21;
                    do {
                      if (0 < (int)uVar3) {
                        uVar28 = 0;
                        do {
                          fVar36 = *(float *)((long)pvVar30 + uVar28 * 4);
                          fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                          if (fVar36 <= fVar37) {
                            fVar36 = fVar37;
                          }
                          *(float *)((long)pvVar22 + uVar28 * 4) = fVar36;
                          uVar28 = uVar28 + 1;
                        } while (uVar20 != uVar28);
                      }
                      iVar13 = iVar13 + 1;
                      pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                      pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                    } while (iVar13 != iVar34);
                  }
                  uVar35 = uVar35 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar10);
                  pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
                } while (uVar35 != uVar19);
                return 0;
              }
              return 0;
            }
          }
          else {
            Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 != (void *)0x0) {
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 == 0) {
                return -100;
              }
              if (0 < (int)uVar14) {
                pvVar29 = a->data;
                sVar7 = a->elemsize;
                pvVar21 = a[1].data;
                sVar8 = a[1].elemsize;
                sVar9 = this_00->elemsize;
                sVar10 = a[1].cstep;
                sVar11 = a->cstep;
                uVar19 = 0;
                do {
                  if (0 < (int)uVar18) {
                    uVar28 = 0;
                    do {
                      fVar36 = *(float *)((long)pvVar21 + uVar28 * 4);
                      fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                      if (fVar36 <= fVar37) {
                        fVar36 = fVar37;
                      }
                      *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                      uVar28 = uVar28 + 1;
                    } while (uVar18 != uVar28);
                  }
                  uVar19 = uVar19 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
                  pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
                  pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
                } while (uVar19 != uVar35);
                return 0;
              }
              return 0;
            }
          }
        }
        else {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a[1].elemsize;
              sVar9 = a[1].cstep;
              pvVar21 = a[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = a->cstep;
              uVar35 = 0;
              do {
                if (0 < iVar13) {
                  lVar16 = 0;
                  pvVar22 = pvVar29;
                  pvVar30 = pvVar31;
                  do {
                    if (0 < (int)uVar15) {
                      fVar36 = *(float *)((long)pvVar21 + lVar16 * 4 + sVar8 * sVar9 * uVar35);
                      uVar20 = 0;
                      do {
                        fVar37 = *(float *)((long)pvVar22 + uVar20 * 4);
                        if (fVar37 <= fVar36) {
                          fVar37 = fVar36;
                        }
                        *(float *)((long)pvVar30 + uVar20 * 4) = fVar37;
                        uVar20 = uVar20 + 1;
                      } while (uVar28 != uVar20);
                    }
                    lVar16 = lVar16 + 1;
                    pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                    pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
                  } while (lVar16 != lVar17);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
        }
      }
      else {
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              sVar9 = a[1].elemsize;
              sVar10 = a[1].cstep;
              sVar11 = this_00->elemsize;
              pvVar21 = a[1].data;
              uVar35 = 0;
              do {
                if (0 < (int)uVar4) {
                  pvVar30 = (void *)(sVar6 * sVar11 * uVar35 + (long)pvVar31);
                  pvVar32 = (void *)(sVar9 * sVar10 * uVar35 + (long)pvVar21);
                  pvVar22 = (void *)(sVar7 * sVar8 * uVar35 + (long)pvVar29);
                  uVar15 = 0;
                  do {
                    if (0 < iVar34) {
                      lVar17 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          fVar36 = *(float *)((long)pvVar22 + lVar17 * 4);
                          uVar28 = 0;
                          do {
                            fVar37 = *(float *)((long)pvVar32 + uVar28 * 4);
                            if (fVar37 <= fVar36) {
                              fVar37 = fVar36;
                            }
                            *(float *)((long)pvVar30 + uVar28 * 4) = fVar37;
                            uVar28 = uVar28 + 1;
                          } while (uVar20 != uVar28);
                        }
                        pvVar32 = (void *)((long)pvVar32 + lVar25 * 4);
                        pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                        lVar17 = lVar17 + 1;
                      } while (lVar17 != lVar16);
                    }
                    pvVar22 = (void *)((long)pvVar22 + lVar16 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar15 != uVar4);
                }
                uVar35 = uVar35 + 1;
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (a[1].dims == 1) {
            if (a[1].w != 1) {
              if (0 < (int)uVar14) {
                pvVar29 = a->data;
                sVar7 = a->elemsize;
                pvVar21 = a[1].data;
                sVar8 = this_00->elemsize;
                sVar9 = a->cstep;
                uVar19 = 0;
                do {
                  if (0 < (int)uVar18) {
                    fVar36 = *(float *)((long)pvVar21 + uVar19 * 4);
                    uVar28 = 0;
                    do {
                      fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                      if (fVar37 <= fVar36) {
                        fVar37 = fVar36;
                      }
                      *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                      uVar28 = uVar28 + 1;
                    } while (uVar18 != uVar28);
                  }
                  uVar19 = uVar19 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
                } while (uVar19 != uVar35);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar14) {
              fVar36 = *pMVar1->data;
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar28 = 0;
                  do {
                    fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                    if (fVar37 <= fVar36) {
                      fVar37 = fVar36;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                    uVar28 = uVar28 + 1;
                  } while (uVar18 != uVar28);
                }
                uVar19 = uVar19 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar19 != uVar35);
              return 0;
            }
            return 0;
          }
          if (a[1].dims != 2) {
            return 0;
          }
          if (0 < (int)uVar14) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            iVar34 = a[1].w;
            sVar8 = a[1].elemsize;
            pvVar21 = a[1].data;
            sVar9 = this_00->elemsize;
            sVar10 = a->cstep;
            uVar19 = 0;
            do {
              if (0 < iVar13) {
                lVar16 = 0;
                pvVar22 = pvVar29;
                pvVar30 = pvVar31;
                do {
                  if (0 < (int)uVar15) {
                    fVar36 = *(float *)((long)pvVar21 + lVar16 * 4 + (long)iVar34 * sVar8 * uVar19);
                    uVar20 = 0;
                    do {
                      fVar37 = *(float *)((long)pvVar22 + uVar20 * 4);
                      if (fVar37 <= fVar36) {
                        fVar37 = fVar36;
                      }
                      *(float *)((long)pvVar30 + uVar20 * 4) = fVar37;
                      uVar20 = uVar20 + 1;
                    } while (uVar28 != uVar20);
                  }
                  lVar16 = lVar16 + 1;
                  pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                  pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
                } while (lVar16 != lVar17);
              }
              uVar19 = uVar19 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar10);
            } while (uVar19 != uVar35);
            return 0;
          }
          return 0;
        }
      }
      break;
    case 4:
      iVar34 = a[1].dims;
      Mat::create(this_00,uVar15,iVar13,uVar2,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (iVar34 == 4) {
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            pvVar21 = a[1].data;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            sVar11 = a->cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar28 = 0;
                do {
                  fVar36 = *(float *)((long)pvVar21 + uVar28 * 4);
                  fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                  if (fVar36 <= fVar37) {
                    fVar36 = fVar37;
                  }
                  *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                  uVar28 = uVar28 + 1;
                } while (uVar18 != uVar28);
              }
              uVar19 = uVar19 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
              pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
            } while (uVar19 != uVar35);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 == 0) {
        return -100;
      }
      iVar34 = a[1].dims;
      if (iVar34 == 1) {
        if (a[1].w != 1) {
          if (0 < (int)uVar14) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            pvVar21 = a[1].data;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar18) {
                fVar36 = *(float *)((long)pvVar21 + uVar19 * 4);
                uVar28 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                  if (fVar37 <= fVar36) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                  uVar28 = uVar28 + 1;
                } while (uVar18 != uVar28);
              }
              uVar19 = uVar19 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
            } while (uVar19 != uVar35);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar36 = *pMVar1->data;
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar18) {
              uVar28 = 0;
              do {
                fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                if (fVar37 <= fVar36) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                uVar28 = uVar28 + 1;
              } while (uVar18 != uVar28);
            }
            uVar19 = uVar19 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      if (iVar34 == 3) {
        if (0 < (int)uVar14) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          sVar9 = a[1].elemsize;
          sVar10 = a[1].cstep;
          sVar11 = this_00->elemsize;
          pvVar21 = a[1].data;
          uVar19 = 0;
          do {
            if (0 < (int)uVar2) {
              pvVar30 = (void *)(sVar6 * sVar11 * uVar19 + (long)pvVar31);
              pvVar22 = (void *)(sVar9 * sVar10 * uVar19 + (long)pvVar21);
              pvVar32 = (void *)(sVar7 * sVar8 * uVar19 + (long)pvVar29);
              uVar14 = 0;
              do {
                if (0 < iVar13) {
                  lVar16 = 0;
                  do {
                    if (0 < (int)uVar15) {
                      fVar36 = *(float *)((long)pvVar22 + lVar16 * 4);
                      uVar20 = 0;
                      do {
                        fVar37 = *(float *)((long)pvVar32 + uVar20 * 4);
                        if (fVar37 <= fVar36) {
                          fVar37 = fVar36;
                        }
                        *(float *)((long)pvVar30 + uVar20 * 4) = fVar37;
                        uVar20 = uVar20 + 1;
                      } while (uVar28 != uVar20);
                    }
                    pvVar32 = (void *)((long)pvVar32 + lVar26 * 4);
                    pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != lVar17);
                }
                pvVar22 = (void *)((long)pvVar22 + lVar17 * 4);
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar2);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      if (iVar34 != 2) {
        return 0;
      }
      if (0 < (int)uVar14) {
        pvVar29 = a->data;
        sVar7 = a->elemsize;
        sVar8 = a->cstep;
        iVar34 = a[1].w;
        sVar9 = a[1].elemsize;
        sVar10 = this_00->elemsize;
        pvVar21 = a[1].data;
        uVar19 = 0;
        do {
          if (0 < (int)uVar2) {
            pvVar22 = (void *)(sVar6 * sVar10 * uVar19 + (long)pvVar31);
            pvVar30 = (void *)(sVar7 * sVar8 * uVar19 + (long)pvVar29);
            uVar20 = 0;
            do {
              if (0 < iVar13) {
                fVar36 = *(float *)((long)pvVar21 + uVar20 * 4 + (long)iVar34 * sVar9 * uVar19);
                iVar33 = 0;
                do {
                  if (0 < (int)uVar15) {
                    uVar27 = 0;
                    do {
                      fVar37 = *(float *)((long)pvVar30 + uVar27 * 4);
                      if (fVar37 <= fVar36) {
                        fVar37 = fVar36;
                      }
                      *(float *)((long)pvVar22 + uVar27 * 4) = fVar37;
                      uVar27 = uVar27 + 1;
                    } while (uVar28 != uVar27);
                  }
                  pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                  pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
                  iVar33 = iVar33 + 1;
                } while (iVar33 != iVar13);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != uVar2);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar35);
        return 0;
      }
      return 0;
    }
    return -100;
  case 5:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar15 = a->w;
    lVar26 = (long)(int)uVar15;
    uVar28 = (ulong)uVar15;
    iVar13 = a->h;
    lVar17 = (long)iVar13;
    uVar2 = a->d;
    uVar14 = a->c;
    uVar35 = (ulong)uVar14;
    uVar18 = iVar13 * uVar15 * uVar2;
    sVar6 = a->elemsize;
    uVar3 = a[1].w;
    lVar25 = (long)(int)uVar3;
    uVar20 = (ulong)uVar3;
    iVar34 = a[1].h;
    lVar16 = (long)iVar34;
    uVar4 = a[1].d;
    uVar5 = a[1].c;
    uVar19 = (ulong)uVar5;
    uVar24 = iVar34 * uVar3 * uVar4;
    switch(a->dims) {
    case 1:
      if (uVar15 == 1) {
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar3,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              fVar36 = *a->data;
              pvVar29 = pMVar1->data;
              uVar19 = 0;
              do {
                fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
                if (fVar36 <= fVar37) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                uVar19 = uVar19 + 1;
              } while (uVar20 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        case 2:
          Mat::create(this_00,uVar3,iVar34,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar24) {
              fVar36 = *a->data;
              pvVar29 = pMVar1->data;
              uVar19 = 0;
              do {
                fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
                if (fVar36 <= fVar37) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                uVar19 = uVar19 + 1;
              } while (uVar24 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar29 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar28 = 0;
                  do {
                    fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                    if (fVar36 <= fVar37) {
                      fVar37 = fVar36;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar29 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar28 = 0;
                  do {
                    fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                    if (fVar36 <= fVar37) {
                      fVar37 = fVar36;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      switch(a[1].dims) {
      case 1:
        Mat::create(this_00,uVar15,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].w != 1) {
          if (0 < (int)uVar15) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            uVar19 = 0;
            do {
              fVar36 = *(float *)((long)pvVar21 + uVar19 * 4);
              fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
              if (fVar37 <= fVar36) {
                fVar36 = fVar37;
              }
              *(float *)((long)pvVar31 + uVar19 * 4) = fVar36;
              uVar19 = uVar19 + 1;
            } while (uVar28 != uVar19);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar15) {
          fVar36 = *pMVar1->data;
          pvVar29 = a->data;
          uVar19 = 0;
          do {
            fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
            if (fVar36 <= fVar37) {
              fVar37 = fVar36;
            }
            *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
            uVar19 = uVar19 + 1;
          } while (uVar28 != uVar19);
          return 0;
        }
        return 0;
      case 2:
        Mat::create(this_00,uVar3,iVar34,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < iVar34) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            lVar17 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar36 = *(float *)((long)pvVar29 + lVar17 * 4);
                uVar19 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar21 + uVar19 * 4);
                  if (fVar36 <= fVar37) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                  uVar19 = uVar19 + 1;
                } while (uVar20 != uVar19);
              }
              lVar17 = lVar17 + 1;
              pvVar31 = (void *)((long)pvVar31 + lVar25 * 4);
              pvVar21 = (void *)((long)pvVar21 + lVar25 * 4);
            } while (lVar17 != lVar16);
            return 0;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar35 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar29 + uVar35 * 4);
                uVar28 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar21 + uVar28 * 4);
                  if (fVar36 <= fVar37) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                  uVar28 = uVar28 + 1;
                } while (uVar24 != uVar28);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      case 4:
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar35 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar29 + uVar35 * 4);
                uVar28 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar21 + uVar28 * 4);
                  if (fVar36 <= fVar37) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                  uVar28 = uVar28 + 1;
                } while (uVar24 != uVar28);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      pAVar12 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            pvVar21 = a[1].data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            uVar35 = 0;
            do {
              if (0 < iVar34) {
                lVar17 = 0;
                pvVar22 = pvVar31;
                pvVar30 = pvVar21;
                do {
                  if (0 < (int)uVar3) {
                    fVar36 = *(float *)((long)pvVar29 + lVar17 * 4 + (long)iVar13 * sVar7 * uVar35);
                    uVar28 = 0;
                    do {
                      fVar37 = *(float *)((long)pvVar30 + uVar28 * 4);
                      if (fVar36 <= fVar37) {
                        fVar37 = fVar36;
                      }
                      *(float *)((long)pvVar22 + uVar28 * 4) = fVar37;
                      uVar28 = uVar28 + 1;
                    } while (uVar20 != uVar28);
                  }
                  lVar17 = lVar17 + 1;
                  pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                  pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                } while (lVar17 != lVar16);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            sVar10 = this_00->elemsize;
            pvVar21 = a[1].data;
            uVar35 = 0;
            do {
              if (0 < (int)uVar4) {
                pvVar30 = (void *)(sVar6 * sVar10 * uVar35 + (long)pvVar31);
                pvVar22 = (void *)(sVar8 * sVar9 * uVar35 + (long)pvVar21);
                uVar28 = 0;
                do {
                  if (0 < iVar34) {
                    fVar36 = *(float *)((long)pvVar29 + uVar28 * 4 + (long)iVar13 * sVar7 * uVar35);
                    iVar33 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar27 = 0;
                        do {
                          fVar37 = *(float *)((long)pvVar22 + uVar27 * 4);
                          if (fVar36 <= fVar37) {
                            fVar37 = fVar36;
                          }
                          *(float *)((long)pvVar30 + uVar27 * 4) = fVar37;
                          uVar27 = uVar27 + 1;
                        } while (uVar20 != uVar27);
                      }
                      pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                      pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                      iVar33 = iVar33 + 1;
                    } while (iVar33 != iVar34);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar4);
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar15,iVar13,sVar6,pAVar12);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar18) {
          pvVar29 = a->data;
          pvVar21 = a[1].data;
          uVar19 = 0;
          do {
            fVar36 = *(float *)((long)pvVar21 + uVar19 * 4);
            fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
            if (fVar37 <= fVar36) {
              fVar36 = fVar37;
            }
            *(float *)((long)pvVar31 + uVar19 * 4) = fVar36;
            uVar19 = uVar19 + 1;
          } while (uVar18 != uVar19);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar15,iVar13,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].w != 1) {
        if (0 < iVar13) {
          pvVar29 = a->data;
          pvVar21 = a[1].data;
          lVar16 = 0;
          do {
            if (0 < (int)uVar15) {
              fVar36 = *(float *)((long)pvVar21 + lVar16 * 4);
              uVar19 = 0;
              do {
                fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
                if (fVar36 <= fVar37) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                uVar19 = uVar19 + 1;
              } while (uVar28 != uVar19);
            }
            lVar16 = lVar16 + 1;
            pvVar31 = (void *)((long)pvVar31 + lVar26 * 4);
            pvVar29 = (void *)((long)pvVar29 + lVar26 * 4);
          } while (lVar16 != lVar17);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar18) {
        fVar36 = *pMVar1->data;
        pvVar29 = a->data;
        uVar19 = 0;
        do {
          fVar37 = *(float *)((long)pvVar29 + uVar19 * 4);
          if (fVar36 <= fVar37) {
            fVar37 = fVar36;
          }
          *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
          uVar19 = uVar19 + 1;
        } while (uVar18 != uVar19);
        return 0;
      }
      return 0;
    case 3:
      if (a[1].dims == 3) {
        if (((uVar3 == 1) && (iVar34 == 1)) && (uVar5 == uVar14)) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              pvVar21 = a[1].data;
              sVar8 = a[1].elemsize;
              sVar9 = a[1].cstep;
              sVar10 = this_00->elemsize;
              sVar11 = a->cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar28 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar21 + sVar8 * sVar9 * uVar19);
                    fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                    if (fVar37 <= fVar36) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar18 != uVar28);
                }
                uVar19 = uVar19 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
              } while (uVar19 != uVar35);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar3 == uVar15) && (uVar5 == 1 && iVar34 == iVar13)) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              pvVar21 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar28 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar21 + uVar28 * 4);
                    fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                    if (fVar37 <= fVar36) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar18 != uVar28);
                }
                uVar19 = uVar19 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar19 != uVar35);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar15 == 1) && ((iVar13 == 1 && (uVar5 == uVar14)))) {
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              pvVar21 = a[1].data;
              sVar9 = a[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar28 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar21 + uVar28 * 4);
                    fVar37 = *(float *)((long)pvVar29 + sVar7 * sVar8 * uVar35);
                    if (fVar37 <= fVar36) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar3 == uVar15) && (uVar14 == 1 && iVar13 == iVar34)) {
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              pvVar21 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar28 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar21 + uVar28 * 4);
                    fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                    if (fVar37 <= fVar36) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar24 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar15 != 1) && (uVar3 == 1)) && (iVar34 == iVar13)) && (uVar5 == uVar14)) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a[1].elemsize;
              sVar9 = a[1].cstep;
              pvVar21 = a[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = a->cstep;
              uVar35 = 0;
              do {
                if (0 < iVar13) {
                  lVar16 = 0;
                  pvVar22 = pvVar29;
                  pvVar30 = pvVar31;
                  do {
                    if (0 < (int)uVar15) {
                      fVar36 = *(float *)((long)pvVar21 + lVar16 * 4 + sVar8 * sVar9 * uVar35);
                      uVar20 = 0;
                      do {
                        fVar37 = *(float *)((long)pvVar22 + uVar20 * 4);
                        if (fVar36 <= fVar37) {
                          fVar37 = fVar36;
                        }
                        *(float *)((long)pvVar30 + uVar20 * 4) = fVar37;
                        uVar20 = uVar20 + 1;
                      } while (uVar28 != uVar20);
                    }
                    lVar16 = lVar16 + 1;
                    pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                    pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
                  } while (lVar16 != lVar17);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar3 == uVar15) && (iVar13 != 1)) && ((iVar34 == 1 && (uVar5 == uVar14)))) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              pvVar21 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].elemsize;
              sVar10 = a[1].cstep;
              sVar11 = a->cstep;
              uVar35 = 0;
              do {
                if (0 < iVar13) {
                  iVar34 = 0;
                  pvVar22 = pvVar29;
                  pvVar30 = pvVar31;
                  do {
                    if (0 < (int)uVar15) {
                      uVar20 = 0;
                      do {
                        fVar36 = *(float *)((long)pvVar21 + uVar20 * 4);
                        fVar37 = *(float *)((long)pvVar22 + uVar20 * 4);
                        if (fVar37 <= fVar36) {
                          fVar36 = fVar37;
                        }
                        *(float *)((long)pvVar30 + uVar20 * 4) = fVar36;
                        uVar20 = uVar20 + 1;
                      } while (uVar28 != uVar20);
                    }
                    iVar34 = iVar34 + 1;
                    pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                    pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
                  } while (iVar34 != iVar13);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar10);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar15 == 1) && (uVar3 != 1)) && (iVar34 == iVar13)) && (uVar5 == uVar14)) {
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              pvVar21 = a[1].data;
              sVar9 = a[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < iVar34) {
                  lVar17 = 0;
                  pvVar22 = pvVar31;
                  pvVar30 = pvVar21;
                  do {
                    if (0 < (int)uVar3) {
                      fVar36 = *(float *)((long)pvVar29 + lVar17 * 4 + sVar7 * sVar8 * uVar35);
                      uVar28 = 0;
                      do {
                        fVar37 = *(float *)((long)pvVar30 + uVar28 * 4);
                        if (fVar36 <= fVar37) {
                          fVar37 = fVar36;
                        }
                        *(float *)((long)pvVar22 + uVar28 * 4) = fVar37;
                        uVar28 = uVar28 + 1;
                      } while (uVar20 != uVar28);
                    }
                    lVar17 = lVar17 + 1;
                    pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                    pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                  } while (lVar17 != lVar16);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar3 != uVar15) || (iVar34 == 1)) || (iVar13 != 1)) || (uVar5 != uVar14)) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              pvVar21 = a[1].data;
              sVar8 = a[1].elemsize;
              sVar9 = this_00->elemsize;
              sVar10 = a[1].cstep;
              sVar11 = a->cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar28 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar21 + uVar28 * 4);
                    fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                    if (fVar37 <= fVar36) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar18 != uVar28);
                }
                uVar19 = uVar19 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
                pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
              } while (uVar19 != uVar35);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            pvVar21 = a[1].data;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = a->cstep;
            uVar35 = 0;
            do {
              if (0 < iVar34) {
                iVar13 = 0;
                pvVar22 = pvVar31;
                pvVar30 = pvVar21;
                do {
                  if (0 < (int)uVar3) {
                    uVar28 = 0;
                    do {
                      fVar36 = *(float *)((long)pvVar30 + uVar28 * 4);
                      fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                      if (fVar37 <= fVar36) {
                        fVar36 = fVar37;
                      }
                      *(float *)((long)pvVar22 + uVar28 * 4) = fVar36;
                      uVar28 = uVar28 + 1;
                    } while (uVar20 != uVar28);
                  }
                  iVar13 = iVar13 + 1;
                  pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                  pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                } while (iVar13 != iVar34);
              }
              uVar35 = uVar35 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar10);
              pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar21 = a[1].data;
            uVar35 = 0;
            do {
              if (0 < (int)uVar4) {
                pvVar30 = (void *)(sVar6 * sVar11 * uVar35 + (long)pvVar31);
                pvVar32 = (void *)(sVar9 * sVar10 * uVar35 + (long)pvVar21);
                pvVar22 = (void *)(sVar7 * sVar8 * uVar35 + (long)pvVar29);
                uVar15 = 0;
                do {
                  if (0 < iVar34) {
                    lVar17 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        fVar36 = *(float *)((long)pvVar22 + lVar17 * 4);
                        uVar28 = 0;
                        do {
                          fVar37 = *(float *)((long)pvVar32 + uVar28 * 4);
                          if (fVar36 <= fVar37) {
                            fVar37 = fVar36;
                          }
                          *(float *)((long)pvVar30 + uVar28 * 4) = fVar37;
                          uVar28 = uVar28 + 1;
                        } while (uVar20 != uVar28);
                      }
                      pvVar32 = (void *)((long)pvVar32 + lVar25 * 4);
                      pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                      lVar17 = lVar17 + 1;
                    } while (lVar17 != lVar16);
                  }
                  pvVar22 = (void *)((long)pvVar22 + lVar16 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar15 != uVar4);
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar19);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          iVar34 = a[1].w;
          sVar8 = a[1].elemsize;
          pvVar21 = a[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = a->cstep;
          uVar19 = 0;
          do {
            if (0 < iVar13) {
              lVar16 = 0;
              pvVar22 = pvVar29;
              pvVar30 = pvVar31;
              do {
                if (0 < (int)uVar15) {
                  fVar36 = *(float *)((long)pvVar21 + lVar16 * 4 + (long)iVar34 * sVar8 * uVar19);
                  uVar20 = 0;
                  do {
                    fVar37 = *(float *)((long)pvVar22 + uVar20 * 4);
                    if (fVar36 <= fVar37) {
                      fVar37 = fVar36;
                    }
                    *(float *)((long)pvVar30 + uVar20 * 4) = fVar37;
                    uVar20 = uVar20 + 1;
                  } while (uVar28 != uVar20);
                }
                lVar16 = lVar16 + 1;
                pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
              } while (lVar16 != lVar17);
            }
            uVar19 = uVar19 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar10);
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      if (a[1].w != 1) {
        if (0 < (int)uVar14) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          pvVar21 = a[1].data;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar18) {
              fVar36 = *(float *)((long)pvVar21 + uVar19 * 4);
              uVar28 = 0;
              do {
                fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                if (fVar36 <= fVar37) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                uVar28 = uVar28 + 1;
              } while (uVar18 != uVar28);
            }
            uVar19 = uVar19 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar14) {
        fVar36 = *pMVar1->data;
        pvVar29 = a->data;
        sVar7 = a->elemsize;
        sVar8 = this_00->elemsize;
        sVar9 = a->cstep;
        uVar19 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar28 = 0;
            do {
              fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
              if (fVar36 <= fVar37) {
                fVar37 = fVar36;
              }
              *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
              uVar28 = uVar28 + 1;
            } while (uVar18 != uVar28);
          }
          uVar19 = uVar19 + 1;
          pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
          pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
        } while (uVar19 != uVar35);
        return 0;
      }
      return 0;
    case 4:
      iVar34 = a[1].dims;
      Mat::create(this_00,uVar15,iVar13,uVar2,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (iVar34 == 4) {
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            pvVar21 = a[1].data;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            sVar11 = a->cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar18) {
                uVar28 = 0;
                do {
                  fVar36 = *(float *)((long)pvVar21 + uVar28 * 4);
                  fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                  if (fVar37 <= fVar36) {
                    fVar36 = fVar37;
                  }
                  *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                  uVar28 = uVar28 + 1;
                } while (uVar18 != uVar28);
              }
              uVar19 = uVar19 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
              pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
            } while (uVar19 != uVar35);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 == 0) {
        return -100;
      }
      iVar34 = a[1].dims;
      if (iVar34 != 1) {
        if (iVar34 == 3) {
          if (0 < (int)uVar14) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar21 = a[1].data;
            uVar19 = 0;
            do {
              if (0 < (int)uVar2) {
                pvVar30 = (void *)(sVar6 * sVar11 * uVar19 + (long)pvVar31);
                pvVar22 = (void *)(sVar9 * sVar10 * uVar19 + (long)pvVar21);
                pvVar32 = (void *)(sVar7 * sVar8 * uVar19 + (long)pvVar29);
                uVar14 = 0;
                do {
                  if (0 < iVar13) {
                    lVar16 = 0;
                    do {
                      if (0 < (int)uVar15) {
                        fVar36 = *(float *)((long)pvVar22 + lVar16 * 4);
                        uVar20 = 0;
                        do {
                          fVar37 = *(float *)((long)pvVar32 + uVar20 * 4);
                          if (fVar36 <= fVar37) {
                            fVar37 = fVar36;
                          }
                          *(float *)((long)pvVar30 + uVar20 * 4) = fVar37;
                          uVar20 = uVar20 + 1;
                        } while (uVar28 != uVar20);
                      }
                      pvVar32 = (void *)((long)pvVar32 + lVar26 * 4);
                      pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != lVar17);
                  }
                  pvVar22 = (void *)((long)pvVar22 + lVar17 * 4);
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar2);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar35);
            return 0;
          }
          return 0;
        }
        if (iVar34 != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          iVar34 = a[1].w;
          sVar9 = a[1].elemsize;
          sVar10 = this_00->elemsize;
          pvVar21 = a[1].data;
          uVar19 = 0;
          do {
            if (0 < (int)uVar2) {
              pvVar22 = (void *)(sVar6 * sVar10 * uVar19 + (long)pvVar31);
              pvVar30 = (void *)(sVar7 * sVar8 * uVar19 + (long)pvVar29);
              uVar20 = 0;
              do {
                if (0 < iVar13) {
                  fVar36 = *(float *)((long)pvVar21 + uVar20 * 4 + (long)iVar34 * sVar9 * uVar19);
                  iVar33 = 0;
                  do {
                    if (0 < (int)uVar15) {
                      uVar27 = 0;
                      do {
                        fVar37 = *(float *)((long)pvVar30 + uVar27 * 4);
                        if (fVar36 <= fVar37) {
                          fVar37 = fVar36;
                        }
                        *(float *)((long)pvVar22 + uVar27 * 4) = fVar37;
                        uVar27 = uVar27 + 1;
                      } while (uVar28 != uVar27);
                    }
                    pvVar30 = (void *)((long)pvVar30 + lVar26 * 4);
                    pvVar22 = (void *)((long)pvVar22 + lVar26 * 4);
                    iVar33 = iVar33 + 1;
                  } while (iVar33 != iVar13);
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar2);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      if (a[1].w != 1) {
        if (0 < (int)uVar14) {
          pvVar29 = a->data;
          sVar7 = a->elemsize;
          pvVar21 = a[1].data;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar18) {
              fVar36 = *(float *)((long)pvVar21 + uVar19 * 4);
              uVar28 = 0;
              do {
                fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
                if (fVar36 <= fVar37) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                uVar28 = uVar28 + 1;
              } while (uVar18 != uVar28);
            }
            uVar19 = uVar19 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
          } while (uVar19 != uVar35);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar14) {
        fVar36 = *pMVar1->data;
        pvVar29 = a->data;
        sVar7 = a->elemsize;
        sVar8 = this_00->elemsize;
        sVar9 = a->cstep;
        uVar19 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar28 = 0;
            do {
              fVar37 = *(float *)((long)pvVar29 + uVar28 * 4);
              if (fVar36 <= fVar37) {
                fVar37 = fVar36;
              }
              *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
              uVar28 = uVar28 + 1;
            } while (uVar18 != uVar28);
          }
          uVar19 = uVar19 + 1;
          pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
          pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
        } while (uVar19 != uVar35);
        return 0;
      }
      return 0;
    }
LAB_003bb987:
    return 0;
  case 6:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar15 = a->w;
    lVar16 = (long)(int)uVar15;
    uVar28 = (ulong)uVar15;
    iVar13 = a->h;
    lVar26 = (long)iVar13;
    uVar2 = a->d;
    uVar14 = a->c;
    uVar20 = (ulong)uVar14;
    uVar24 = iVar13 * uVar15 * uVar2;
    sVar6 = a->elemsize;
    uVar3 = a[1].w;
    lVar25 = (long)(int)uVar3;
    uVar35 = (ulong)uVar3;
    iVar34 = a[1].h;
    lVar17 = (long)iVar34;
    uVar4 = a[1].d;
    uVar5 = a[1].c;
    uVar19 = (ulong)uVar5;
    uVar18 = iVar34 * uVar3 * uVar4;
    switch(a->dims) {
    case 1:
      if (uVar15 == 1) {
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar3,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar3) {
              fVar36 = *a->data;
              pvVar29 = pMVar1->data;
              uVar19 = 0;
              do {
                fVar37 = powf(fVar36,*(float *)((long)pvVar29 + uVar19 * 4));
                *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                uVar19 = uVar19 + 1;
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          break;
        case 2:
          Mat::create(this_00,uVar3,iVar34,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar18) {
              fVar36 = *a->data;
              pvVar29 = pMVar1->data;
              uVar19 = 0;
              do {
                fVar37 = powf(fVar36,*(float *)((long)pvVar29 + uVar19 * 4));
                *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                uVar19 = uVar19 + 1;
              } while (uVar18 != uVar19);
              return 0;
            }
            return 0;
          }
          break;
        case 3:
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar29 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar28 = 0;
                  do {
                    fVar37 = powf(fVar36,*(float *)((long)pvVar29 + uVar28 * 4));
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                    uVar28 = uVar28 + 1;
                  } while (uVar18 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          break;
        case 4:
          Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar29 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar28 = 0;
                  do {
                    fVar37 = powf(fVar36,*(float *)((long)pvVar29 + uVar28 * 4));
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                    uVar28 = uVar28 + 1;
                  } while (uVar18 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          break;
        default:
          goto switchD_003b3b0e_default;
        }
      }
      else {
switchD_003b3b0e_default:
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar15,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (a[1].w == 1) {
              if (0 < (int)uVar15) {
                fVar36 = *pMVar1->data;
                pvVar29 = a->data;
                uVar19 = 0;
                do {
                  fVar37 = powf(*(float *)((long)pvVar29 + uVar19 * 4),fVar36);
                  *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                  uVar19 = uVar19 + 1;
                } while (uVar28 != uVar19);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar15) {
              pvVar29 = a->data;
              pvVar21 = a[1].data;
              uVar19 = 0;
              do {
                fVar36 = powf(*(float *)((long)pvVar29 + uVar19 * 4),
                              *(float *)((long)pvVar21 + uVar19 * 4));
                *(float *)((long)pvVar31 + uVar19 * 4) = fVar36;
                uVar19 = uVar19 + 1;
              } while (uVar28 != uVar19);
              return 0;
            }
            return 0;
          }
          break;
        case 2:
          Mat::create(this_00,uVar3,iVar34,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (0 < iVar34) {
              pvVar29 = a->data;
              pvVar21 = a[1].data;
              lVar16 = 0;
              do {
                if (0 < (int)uVar3) {
                  fVar36 = *(float *)((long)pvVar29 + lVar16 * 4);
                  uVar19 = 0;
                  do {
                    fVar37 = powf(fVar36,*(float *)((long)pvVar21 + uVar19 * 4));
                    *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                    uVar19 = uVar19 + 1;
                  } while (uVar35 != uVar19);
                }
                lVar16 = lVar16 + 1;
                pvVar31 = (void *)((long)pvVar31 + lVar25 * 4);
                pvVar21 = (void *)((long)pvVar21 + lVar25 * 4);
              } while (lVar16 != lVar17);
              return 0;
            }
            return 0;
          }
          break;
        case 3:
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              pvVar21 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar18) {
                  fVar36 = *(float *)((long)pvVar29 + uVar35 * 4);
                  uVar28 = 0;
                  do {
                    fVar37 = powf(fVar36,*(float *)((long)pvVar21 + uVar28 * 4));
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                    uVar28 = uVar28 + 1;
                  } while (uVar18 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          break;
        case 4:
          Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              pvVar21 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar18) {
                  fVar36 = *(float *)((long)pvVar29 + uVar35 * 4);
                  uVar28 = 0;
                  do {
                    fVar37 = powf(fVar36,*(float *)((long)pvVar21 + uVar28 * 4));
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar37;
                    uVar28 = uVar28 + 1;
                  } while (uVar18 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
          break;
        default:
          return 0;
        }
      }
      break;
    case 2:
      pAVar12 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,pAVar12);
        local_80 = this_00->data;
        if (local_80 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar31 = a->data;
            local_60 = a[1].data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            local_78 = (void *)0x0;
            do {
              if (0 < iVar34) {
                lVar16 = 0;
                pvVar29 = local_80;
                pvVar21 = local_60;
                do {
                  if (0 < (int)uVar3) {
                    fVar36 = *(float *)((long)pvVar31 +
                                       lVar16 * 4 + (long)iVar13 * sVar7 * (long)local_78);
                    uVar28 = 0;
                    do {
                      fVar37 = powf(fVar36,*(float *)((long)pvVar21 + uVar28 * 4));
                      *(float *)((long)pvVar29 + uVar28 * 4) = fVar37;
                      uVar28 = uVar28 + 1;
                    } while (uVar35 != uVar28);
                  }
                  lVar16 = lVar16 + 1;
                  pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                  pvVar21 = (void *)((long)pvVar21 + lVar25 * 4);
                } while (lVar16 != lVar17);
              }
              local_78 = (void *)((long)local_78 + 1);
              local_80 = (void *)((long)local_80 + sVar6 * sVar9);
              local_60 = (void *)((long)local_60 + sVar8 * sVar10);
            } while (local_78 != (void *)uVar19);
            return 0;
          }
          return 0;
        }
      }
      else if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            sVar10 = this_00->elemsize;
            pvVar21 = a[1].data;
            local_60 = (void *)0x0;
            do {
              if (0 < (int)uVar4) {
                pvVar22 = (void *)(sVar6 * sVar10 * (long)local_60 + (long)pvVar31);
                pvVar30 = (void *)(sVar8 * sVar9 * (long)local_60 + (long)pvVar21);
                uVar28 = 0;
                do {
                  if (0 < iVar34) {
                    fVar36 = *(float *)((long)pvVar29 +
                                       uVar28 * 4 + (long)iVar13 * sVar7 * (long)local_60);
                    iVar33 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar20 = 0;
                        do {
                          fVar37 = powf(fVar36,*(float *)((long)pvVar30 + uVar20 * 4));
                          *(float *)((long)pvVar22 + uVar20 * 4) = fVar37;
                          uVar20 = uVar20 + 1;
                        } while (uVar35 != uVar20);
                      }
                      pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                      pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                      iVar33 = iVar33 + 1;
                    } while (iVar33 != iVar34);
                  }
                  uVar28 = uVar28 + 1;
                } while (uVar28 != uVar4);
              }
              local_60 = (void *)((long)local_60 + 1);
            } while (local_60 != (void *)uVar19);
            return 0;
          }
          return 0;
        }
      }
      else {
        Mat::create(this_00,uVar15,iVar13,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if ((pvVar31 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          if (a[1].dims != 1) {
            if (a[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar24) {
              pvVar29 = a->data;
              pvVar21 = a[1].data;
              uVar19 = 0;
              do {
                fVar36 = powf(*(float *)((long)pvVar29 + uVar19 * 4),
                              *(float *)((long)pvVar21 + uVar19 * 4));
                *(float *)((long)pvVar31 + uVar19 * 4) = fVar36;
                uVar19 = uVar19 + 1;
              } while (uVar24 != uVar19);
              return 0;
            }
            return 0;
          }
          Mat::create(this_00,uVar15,iVar13,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (a[1].w != 1) {
            if (0 < iVar13) {
              pvVar29 = a->data;
              pvVar21 = a[1].data;
              lVar17 = 0;
              do {
                if (0 < (int)uVar15) {
                  fVar36 = *(float *)((long)pvVar21 + lVar17 * 4);
                  uVar19 = 0;
                  do {
                    fVar37 = powf(*(float *)((long)pvVar29 + uVar19 * 4),fVar36);
                    *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
                    uVar19 = uVar19 + 1;
                  } while (uVar28 != uVar19);
                }
                lVar17 = lVar17 + 1;
                pvVar31 = (void *)((long)pvVar31 + lVar16 * 4);
                pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
              } while (lVar17 != lVar26);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar24) {
            fVar36 = *pMVar1->data;
            pvVar29 = a->data;
            uVar19 = 0;
            do {
              fVar37 = powf(*(float *)((long)pvVar29 + uVar19 * 4),fVar36);
              *(float *)((long)pvVar31 + uVar19 * 4) = fVar37;
              uVar19 = uVar19 + 1;
            } while (uVar24 != uVar19);
            return 0;
          }
          return 0;
        }
      }
      break;
    case 3:
      if (a[1].dims == 3) {
        if (((uVar3 == 1) && (iVar34 == 1)) && (uVar5 == uVar14)) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar14) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              pvVar21 = a[1].data;
              sVar8 = a[1].elemsize;
              sVar9 = a[1].cstep;
              sVar10 = this_00->elemsize;
              sVar11 = a->cstep;
              local_a0 = (void *)0x0;
              do {
                if (0 < (int)uVar24) {
                  uVar19 = 0;
                  do {
                    fVar36 = powf(*(float *)((long)pvVar29 + uVar19 * 4),
                                  *(float *)((long)pvVar21 + sVar8 * sVar9 * (long)local_a0));
                    *(float *)((long)pvVar31 + uVar19 * 4) = fVar36;
                    uVar19 = uVar19 + 1;
                  } while (uVar24 != uVar19);
                }
                local_a0 = (void *)((long)local_a0 + 1);
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
              } while (local_a0 != (void *)uVar20);
              return 0;
            }
            return 0;
          }
        }
        else if ((uVar3 == uVar15) && (uVar5 == 1 && iVar34 == iVar13)) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar14) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              pvVar21 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar35 = 0;
                  do {
                    fVar36 = powf(*(float *)((long)pvVar29 + uVar35 * 4),
                                  *(float *)((long)pvVar21 + uVar35 * 4));
                    *(float *)((long)pvVar31 + uVar35 * 4) = fVar36;
                    uVar35 = uVar35 + 1;
                  } while (uVar24 != uVar35);
                }
                uVar19 = uVar19 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar9);
              } while (uVar19 != uVar20);
              return 0;
            }
            return 0;
          }
        }
        else if ((uVar15 == 1) && ((iVar13 == 1 && (uVar5 == uVar14)))) {
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              pvVar21 = a[1].data;
              sVar9 = a[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = a[1].cstep;
              local_90 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar35 = 0;
                  do {
                    fVar36 = powf(*(float *)((long)pvVar29 + sVar7 * sVar8 * local_90),
                                  *(float *)((long)pvVar21 + uVar35 * 4));
                    *(float *)((long)pvVar31 + uVar35 * 4) = fVar36;
                    uVar35 = uVar35 + 1;
                  } while (uVar18 != uVar35);
                }
                local_90 = local_90 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar21 = (void *)((long)pvVar21 + sVar9 * sVar11);
              } while (local_90 != uVar19);
              return 0;
            }
            return 0;
          }
        }
        else if ((uVar3 == uVar15) && (uVar14 == 1 && iVar13 == iVar34)) {
          Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar5) {
              pvVar29 = a->data;
              pvVar21 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar35 = 0;
              do {
                if (0 < (int)uVar18) {
                  uVar28 = 0;
                  do {
                    fVar36 = powf(*(float *)((long)pvVar29 + uVar28 * 4),
                                  *(float *)((long)pvVar21 + uVar28 * 4));
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar36;
                    uVar28 = uVar28 + 1;
                  } while (uVar18 != uVar28);
                }
                uVar35 = uVar35 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar9);
              } while (uVar35 != uVar19);
              return 0;
            }
            return 0;
          }
        }
        else if ((((uVar15 == 1) || (uVar3 != 1)) || (iVar34 != iVar13)) || (uVar5 != uVar14)) {
          if (((uVar3 == uVar15) && (iVar13 != 1)) && ((iVar34 == 1 && (uVar5 == uVar14)))) {
            Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
            local_98 = this_00->data;
            if (local_98 != (void *)0x0) {
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 == 0) {
                return -100;
              }
              if (0 < (int)uVar5) {
                local_80 = a->data;
                sVar7 = a->elemsize;
                pvVar31 = a[1].data;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].elemsize;
                sVar10 = a[1].cstep;
                sVar11 = a->cstep;
                local_a0 = (void *)0x0;
                do {
                  if (0 < iVar13) {
                    iVar34 = 0;
                    pvVar29 = local_98;
                    pvVar21 = local_80;
                    do {
                      if (0 < (int)uVar15) {
                        uVar35 = 0;
                        do {
                          fVar36 = powf(*(float *)((long)pvVar21 + uVar35 * 4),
                                        *(float *)((long)pvVar31 + uVar35 * 4));
                          *(float *)((long)pvVar29 + uVar35 * 4) = fVar36;
                          uVar35 = uVar35 + 1;
                        } while (uVar28 != uVar35);
                      }
                      iVar34 = iVar34 + 1;
                      pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                      pvVar21 = (void *)((long)pvVar21 + lVar16 * 4);
                    } while (iVar34 != iVar13);
                  }
                  local_a0 = (void *)((long)local_a0 + 1);
                  local_98 = (void *)((long)local_98 + sVar6 * sVar8);
                  pvVar31 = (void *)((long)pvVar31 + sVar9 * sVar10);
                  local_80 = (void *)((long)local_80 + sVar7 * sVar11);
                } while (local_a0 != (void *)uVar19);
                return 0;
              }
              return 0;
            }
          }
          else if ((((uVar15 == 1) && (uVar3 != 1)) && (iVar34 == iVar13)) && (uVar5 == uVar14)) {
            Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
            local_80 = this_00->data;
            if (local_80 != (void *)0x0) {
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 == 0) {
                return -100;
              }
              if (0 < (int)uVar5) {
                pvVar31 = a->data;
                sVar7 = a->elemsize;
                sVar8 = a->cstep;
                local_60 = a[1].data;
                sVar9 = a[1].elemsize;
                sVar10 = this_00->elemsize;
                sVar11 = a[1].cstep;
                local_78 = (void *)0x0;
                do {
                  if (0 < iVar34) {
                    lVar16 = 0;
                    pvVar29 = local_80;
                    pvVar21 = local_60;
                    do {
                      if (0 < (int)uVar3) {
                        fVar36 = *(float *)((long)pvVar31 +
                                           lVar16 * 4 + sVar7 * sVar8 * (long)local_78);
                        uVar28 = 0;
                        do {
                          fVar37 = powf(fVar36,*(float *)((long)pvVar21 + uVar28 * 4));
                          *(float *)((long)pvVar29 + uVar28 * 4) = fVar37;
                          uVar28 = uVar28 + 1;
                        } while (uVar35 != uVar28);
                      }
                      lVar16 = lVar16 + 1;
                      pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                      pvVar21 = (void *)((long)pvVar21 + lVar25 * 4);
                    } while (lVar16 != lVar17);
                  }
                  local_78 = (void *)((long)local_78 + 1);
                  local_80 = (void *)((long)local_80 + sVar6 * sVar10);
                  local_60 = (void *)((long)local_60 + sVar9 * sVar11);
                } while (local_78 != (void *)uVar19);
                return 0;
              }
              return 0;
            }
          }
          else if ((((uVar3 == uVar15) && (iVar34 != 1)) && (iVar13 == 1)) && (uVar5 == uVar14)) {
            Mat::create(this_00,uVar3,iVar34,uVar5,sVar6,opt->blob_allocator);
            local_78 = this_00->data;
            if (local_78 != (void *)0x0) {
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 == 0) {
                return -100;
              }
              if (0 < (int)uVar5) {
                pvVar31 = a->data;
                sVar7 = a->elemsize;
                local_80 = a[1].data;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].elemsize;
                sVar10 = a[1].cstep;
                sVar11 = a->cstep;
                local_88 = (void *)0x0;
                do {
                  if (0 < iVar34) {
                    iVar13 = 0;
                    pvVar29 = local_80;
                    pvVar21 = local_78;
                    do {
                      if (0 < (int)uVar3) {
                        uVar28 = 0;
                        do {
                          fVar36 = powf(*(float *)((long)pvVar31 + uVar28 * 4),
                                        *(float *)((long)pvVar29 + uVar28 * 4));
                          *(float *)((long)pvVar21 + uVar28 * 4) = fVar36;
                          uVar28 = uVar28 + 1;
                        } while (uVar35 != uVar28);
                      }
                      iVar13 = iVar13 + 1;
                      pvVar21 = (void *)((long)pvVar21 + lVar25 * 4);
                      pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                    } while (iVar13 != iVar34);
                  }
                  local_88 = (void *)((long)local_88 + 1);
                  local_78 = (void *)((long)local_78 + sVar6 * sVar8);
                  local_80 = (void *)((long)local_80 + sVar9 * sVar10);
                  pvVar31 = (void *)((long)pvVar31 + sVar7 * sVar11);
                } while (local_88 != (void *)uVar19);
                return 0;
              }
              return 0;
            }
          }
          else {
            Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 != (void *)0x0) {
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 == 0) {
                return -100;
              }
              if (0 < (int)uVar14) {
                pvVar29 = a->data;
                sVar7 = a->elemsize;
                pvVar21 = a[1].data;
                sVar8 = a[1].elemsize;
                sVar9 = this_00->elemsize;
                sVar10 = a[1].cstep;
                sVar11 = a->cstep;
                uVar19 = 0;
                do {
                  if (0 < (int)uVar24) {
                    uVar35 = 0;
                    do {
                      fVar36 = powf(*(float *)((long)pvVar29 + uVar35 * 4),
                                    *(float *)((long)pvVar21 + uVar35 * 4));
                      *(float *)((long)pvVar31 + uVar35 * 4) = fVar36;
                      uVar35 = uVar35 + 1;
                    } while (uVar24 != uVar35);
                  }
                  uVar19 = uVar19 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
                  pvVar21 = (void *)((long)pvVar21 + sVar8 * sVar10);
                  pvVar29 = (void *)((long)pvVar29 + sVar7 * sVar11);
                } while (uVar19 != uVar20);
                return 0;
              }
              return 0;
            }
          }
        }
        else {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          local_80 = this_00->data;
          if (local_80 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar5) {
              local_60 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a[1].elemsize;
              sVar9 = a[1].cstep;
              pvVar31 = a[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = a->cstep;
              local_98 = (void *)0x0;
              do {
                if (0 < iVar13) {
                  lVar17 = 0;
                  pvVar29 = local_60;
                  pvVar21 = local_80;
                  do {
                    if (0 < (int)uVar15) {
                      fVar36 = *(float *)((long)pvVar31 +
                                         lVar17 * 4 + sVar8 * sVar9 * (long)local_98);
                      uVar35 = 0;
                      do {
                        fVar37 = powf(*(float *)((long)pvVar29 + uVar35 * 4),fVar36);
                        *(float *)((long)pvVar21 + uVar35 * 4) = fVar37;
                        uVar35 = uVar35 + 1;
                      } while (uVar28 != uVar35);
                    }
                    lVar17 = lVar17 + 1;
                    pvVar21 = (void *)((long)pvVar21 + lVar16 * 4);
                    pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                  } while (lVar17 != lVar26);
                }
                local_98 = (void *)((long)local_98 + 1);
                local_80 = (void *)((long)local_80 + sVar6 * sVar10);
                local_60 = (void *)((long)local_60 + sVar7 * sVar11);
              } while (local_98 != (void *)uVar19);
              return 0;
            }
            return 0;
          }
        }
      }
      else if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar34,uVar4,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar29 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar21 = a[1].data;
            local_60 = (void *)0x0;
            do {
              if (0 < (int)uVar4) {
                pvVar30 = (void *)(sVar6 * sVar11 * (long)local_60 + (long)pvVar31);
                pvVar22 = (void *)(sVar9 * sVar10 * (long)local_60 + (long)pvVar21);
                local_88 = (void *)(sVar7 * sVar8 * (long)local_60 + (long)pvVar29);
                uVar15 = 0;
                do {
                  if (0 < iVar34) {
                    lVar16 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        fVar36 = *(float *)((long)local_88 + lVar16 * 4);
                        uVar28 = 0;
                        do {
                          fVar37 = powf(fVar36,*(float *)((long)pvVar22 + uVar28 * 4));
                          *(float *)((long)pvVar30 + uVar28 * 4) = fVar37;
                          uVar28 = uVar28 + 1;
                        } while (uVar35 != uVar28);
                      }
                      pvVar22 = (void *)((long)pvVar22 + lVar25 * 4);
                      pvVar30 = (void *)((long)pvVar30 + lVar25 * 4);
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != lVar17);
                  }
                  local_88 = (void *)((long)local_88 + lVar17 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar15 != uVar4);
              }
              local_60 = (void *)((long)local_60 + 1);
            } while (local_60 != (void *)uVar19);
            return 0;
          }
          return 0;
        }
      }
      else {
        Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
        local_98 = this_00->data;
        if (local_98 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (a[1].dims == 1) {
            if (a[1].w != 1) {
              if (0 < (int)uVar14) {
                pvVar31 = a->data;
                sVar7 = a->elemsize;
                pvVar29 = a[1].data;
                sVar8 = this_00->elemsize;
                sVar9 = a->cstep;
                uVar19 = 0;
                do {
                  if (0 < (int)uVar24) {
                    fVar36 = *(float *)((long)pvVar29 + uVar19 * 4);
                    uVar35 = 0;
                    do {
                      fVar37 = powf(*(float *)((long)pvVar31 + uVar35 * 4),fVar36);
                      *(float *)((long)local_98 + uVar35 * 4) = fVar37;
                      uVar35 = uVar35 + 1;
                    } while (uVar24 != uVar35);
                  }
                  uVar19 = uVar19 + 1;
                  local_98 = (void *)((long)local_98 + sVar6 * sVar8);
                  pvVar31 = (void *)((long)pvVar31 + sVar7 * sVar9);
                } while (uVar19 != uVar20);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar14) {
              fVar36 = *pMVar1->data;
              pvVar31 = a->data;
              sVar7 = a->elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar35 = 0;
                  do {
                    fVar37 = powf(*(float *)((long)pvVar31 + uVar35 * 4),fVar36);
                    *(float *)((long)local_98 + uVar35 * 4) = fVar37;
                    uVar35 = uVar35 + 1;
                  } while (uVar24 != uVar35);
                }
                uVar19 = uVar19 + 1;
                local_98 = (void *)((long)local_98 + sVar6 * sVar8);
                pvVar31 = (void *)((long)pvVar31 + sVar7 * sVar9);
              } while (uVar19 != uVar20);
              return 0;
            }
            return 0;
          }
          if (a[1].dims != 2) {
            return 0;
          }
          if (0 < (int)uVar14) {
            local_68 = a->data;
            sVar7 = a->elemsize;
            iVar34 = a[1].w;
            sVar8 = a[1].elemsize;
            pvVar31 = a[1].data;
            sVar9 = this_00->elemsize;
            sVar10 = a->cstep;
            local_80 = (void *)0x0;
            do {
              if (0 < iVar13) {
                lVar17 = 0;
                pvVar29 = local_68;
                pvVar21 = local_98;
                do {
                  if (0 < (int)uVar15) {
                    fVar36 = *(float *)((long)pvVar31 +
                                       lVar17 * 4 + (long)iVar34 * sVar8 * (long)local_80);
                    uVar19 = 0;
                    do {
                      fVar37 = powf(*(float *)((long)pvVar29 + uVar19 * 4),fVar36);
                      *(float *)((long)pvVar21 + uVar19 * 4) = fVar37;
                      uVar19 = uVar19 + 1;
                    } while (uVar28 != uVar19);
                  }
                  lVar17 = lVar17 + 1;
                  pvVar21 = (void *)((long)pvVar21 + lVar16 * 4);
                  pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                } while (lVar17 != lVar26);
              }
              local_80 = (void *)((long)local_80 + 1);
              local_98 = (void *)((long)local_98 + sVar6 * sVar9);
              local_68 = (void *)((long)local_68 + sVar7 * sVar10);
            } while (local_80 != (void *)uVar20);
            return 0;
          }
          return 0;
        }
      }
      break;
    case 4:
      iVar34 = a[1].dims;
      Mat::create(this_00,uVar15,iVar13,uVar2,uVar14,sVar6,opt->blob_allocator);
      local_60 = this_00->data;
      if (iVar34 == 4) {
        if (local_60 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar14) {
            pvVar31 = a->data;
            sVar7 = a->elemsize;
            pvVar29 = a[1].data;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            sVar11 = a->cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar24) {
                uVar35 = 0;
                do {
                  fVar36 = powf(*(float *)((long)pvVar31 + uVar35 * 4),
                                *(float *)((long)pvVar29 + uVar35 * 4));
                  *(float *)((long)local_60 + uVar35 * 4) = fVar36;
                  uVar35 = uVar35 + 1;
                } while (uVar24 != uVar35);
              }
              uVar19 = uVar19 + 1;
              local_60 = (void *)((long)local_60 + sVar6 * sVar9);
              pvVar29 = (void *)((long)pvVar29 + sVar8 * sVar10);
              pvVar31 = (void *)((long)pvVar31 + sVar7 * sVar11);
            } while (uVar19 != uVar20);
            return 0;
          }
          return 0;
        }
      }
      else if (local_60 != (void *)0x0) {
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 == 0) {
          return -100;
        }
        iVar34 = a[1].dims;
        if (iVar34 == 1) {
          if (a[1].w != 1) {
            if (0 < (int)uVar14) {
              pvVar31 = a->data;
              sVar7 = a->elemsize;
              pvVar29 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar24) {
                  fVar36 = *(float *)((long)pvVar29 + uVar19 * 4);
                  uVar35 = 0;
                  do {
                    fVar37 = powf(*(float *)((long)pvVar31 + uVar35 * 4),fVar36);
                    *(float *)((long)local_60 + uVar35 * 4) = fVar37;
                    uVar35 = uVar35 + 1;
                  } while (uVar24 != uVar35);
                }
                uVar19 = uVar19 + 1;
                local_60 = (void *)((long)local_60 + sVar6 * sVar8);
                pvVar31 = (void *)((long)pvVar31 + sVar7 * sVar9);
              } while (uVar19 != uVar20);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar14) {
            fVar36 = *pMVar1->data;
            pvVar31 = a->data;
            sVar7 = a->elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar24) {
                uVar35 = 0;
                do {
                  fVar37 = powf(*(float *)((long)pvVar31 + uVar35 * 4),fVar36);
                  *(float *)((long)local_60 + uVar35 * 4) = fVar37;
                  uVar35 = uVar35 + 1;
                } while (uVar24 != uVar35);
              }
              uVar19 = uVar19 + 1;
              local_60 = (void *)((long)local_60 + sVar6 * sVar8);
              pvVar31 = (void *)((long)pvVar31 + sVar7 * sVar9);
            } while (uVar19 != uVar20);
            return 0;
          }
          return 0;
        }
        if (iVar34 == 3) {
          if (0 < (int)uVar14) {
            pvVar31 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar29 = a[1].data;
            local_58 = 0;
            do {
              if (0 < (int)uVar2) {
                pvVar22 = (void *)(sVar6 * sVar11 * local_58 + (long)local_60);
                local_a0 = (void *)(sVar9 * sVar10 * local_58 + (long)pvVar29);
                pvVar21 = (void *)(sVar7 * sVar8 * local_58 + (long)pvVar31);
                uVar14 = 0;
                do {
                  if (0 < iVar13) {
                    lVar17 = 0;
                    do {
                      if (0 < (int)uVar15) {
                        fVar36 = *(float *)((long)local_a0 + lVar17 * 4);
                        uVar19 = 0;
                        do {
                          fVar37 = powf(*(float *)((long)pvVar21 + uVar19 * 4),fVar36);
                          *(float *)((long)pvVar22 + uVar19 * 4) = fVar37;
                          uVar19 = uVar19 + 1;
                        } while (uVar28 != uVar19);
                      }
                      pvVar21 = (void *)((long)pvVar21 + lVar16 * 4);
                      pvVar22 = (void *)((long)pvVar22 + lVar16 * 4);
                      lVar17 = lVar17 + 1;
                    } while (lVar17 != lVar26);
                  }
                  local_a0 = (void *)((long)local_a0 + lVar26 * 4);
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar2);
              }
              local_58 = local_58 + 1;
            } while (local_58 != uVar20);
            return 0;
          }
          return 0;
        }
        if (iVar34 != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar31 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          iVar34 = a[1].w;
          sVar9 = a[1].elemsize;
          sVar10 = this_00->elemsize;
          pvVar29 = a[1].data;
          local_58 = 0;
          do {
            if (0 < (int)uVar2) {
              pvVar22 = (void *)(sVar6 * sVar10 * local_58 + (long)local_60);
              pvVar21 = (void *)(sVar7 * sVar8 * local_58 + (long)pvVar31);
              uVar19 = 0;
              do {
                if (0 < iVar13) {
                  fVar36 = *(float *)((long)pvVar29 + uVar19 * 4 + (long)iVar34 * sVar9 * local_58);
                  iVar33 = 0;
                  do {
                    if (0 < (int)uVar15) {
                      uVar35 = 0;
                      do {
                        fVar37 = powf(*(float *)((long)pvVar21 + uVar35 * 4),fVar36);
                        *(float *)((long)pvVar22 + uVar35 * 4) = fVar37;
                        uVar35 = uVar35 + 1;
                      } while (uVar28 != uVar35);
                    }
                    pvVar21 = (void *)((long)pvVar21 + lVar16 * 4);
                    pvVar22 = (void *)((long)pvVar22 + lVar16 * 4);
                    iVar33 = iVar33 + 1;
                  } while (iVar33 != iVar13);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar2);
            }
            local_58 = local_58 + 1;
          } while (local_58 != uVar20);
          return 0;
        }
        return 0;
      }
    }
    return -100;
  case 7:
    pMVar23 = a;
    a = pMVar1;
    break;
  case 8:
    pMVar23 = a;
    a = pMVar1;
LAB_003b3b9b:
    iVar13 = binary_op<ncnn::binary_op_div>(a,pMVar23,this_00,opt);
    return iVar13;
  }
  iVar13 = binary_op<ncnn::binary_op_sub>(a,pMVar23,this_00,opt);
  return iVar13;
switchD_003b4e4c_caseD_1:
  Mat::create(this_00,uVar15,sVar6,opt->blob_allocator);
  pvVar31 = this_00->data;
  if (pvVar31 == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (a[1].w != 1) {
    if (0 < (int)uVar15) {
      pvVar29 = a->data;
      pvVar21 = a[1].data;
      uVar19 = 0;
      do {
        *(float *)((long)pvVar31 + uVar19 * 4) =
             *(float *)((long)pvVar21 + uVar19 * 4) * *(float *)((long)pvVar29 + uVar19 * 4);
        uVar19 = uVar19 + 1;
      } while (uVar28 != uVar19);
      return 0;
    }
    return 0;
  }
  if (0 < (int)uVar15) {
    fVar36 = *pMVar1->data;
    pvVar29 = a->data;
    uVar19 = 0;
    do {
      *(float *)((long)pvVar31 + uVar19 * 4) = *(float *)((long)pvVar29 + uVar19 * 4) * fVar36;
      uVar19 = uVar19 + 1;
    } while (uVar28 != uVar19);
    return 0;
  }
  return 0;
switchD_003b4ee7_caseD_1:
  Mat::create(this_00,uVar15,sVar6,opt->blob_allocator);
  pvVar31 = this_00->data;
  if (pvVar31 == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (a[1].w != 1) {
    if (0 < (int)uVar15) {
      pvVar29 = a->data;
      pvVar21 = a[1].data;
      uVar19 = 0;
      do {
        *(float *)((long)pvVar31 + uVar19 * 4) =
             *(float *)((long)pvVar21 + uVar19 * 4) + *(float *)((long)pvVar29 + uVar19 * 4);
        uVar19 = uVar19 + 1;
      } while (uVar28 != uVar19);
      return 0;
    }
    return 0;
  }
  if (0 < (int)uVar15) {
    fVar36 = *pMVar1->data;
    pvVar29 = a->data;
    uVar19 = 0;
    do {
      *(float *)((long)pvVar31 + uVar19 * 4) = *(float *)((long)pvVar29 + uVar19 * 4) + fVar36;
      uVar19 = uVar19 + 1;
    } while (uVar28 != uVar19);
    return 0;
  }
  return 0;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);

    return 0;
}